

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(NodeRecordMB4D *__return_storage_ptr__,
         BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
         *this,BuildRecord *current,CachedAllocator alloc,bool toplevel)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  byte bVar3;
  undefined4 uVar4;
  MemoryMonitorInterface *pMVar5;
  ThreadLocal2 *pTVar6;
  iterator iVar7;
  BBox1f *pBVar8;
  void *pvVar9;
  Split *pSVar10;
  Split *pSVar11;
  vint *pvVar12;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  undefined1 auVar13 [16];
  SetMB *set;
  NodeRecordMB4D *pNVar14;
  char cVar15;
  long *plVar16;
  MutexSys *this_00;
  ulong uVar17;
  PrimRefVector pmVar18;
  PrimRefMB *pPVar19;
  BBox1f BVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar21;
  float *pfVar22;
  size_t sVar23;
  runtime_error *prVar24;
  long lVar25;
  BBox1f BVar26;
  BBox1f *pBVar27;
  BBox1f BVar28;
  undefined8 uVar29;
  BuildRecord *current_00;
  size_t begin;
  ulong uVar30;
  ulong uVar31;
  char *pcVar32;
  size_t end;
  unsigned_long uVar33;
  bool bVar34;
  uint uVar35;
  uint uVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar37;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  float fVar40;
  undefined1 auVar39 [16];
  float fVar42;
  float fVar43;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar41;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  task_group_context *in_stack_ffffffffffffe5c8;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1a20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a18;
  HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::RecalculatePrimRef<embree::Instance>,_2UL>
  *local_1a08;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1a00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_19f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_19e8;
  SetMB *local_19d0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_19c8;
  BBox1f time_range1_1;
  BBox1f time_range0_1;
  anon_class_24_3_c5d13451 isLeft;
  undefined8 uStack_1990;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1988;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1978;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1968;
  BBox1f local_1958;
  char acStack_1950 [8];
  BBox1f local_1948;
  BBox1f BStack_1940;
  BBox1f local_1938;
  BBox1f BStack_1930;
  undefined4 local_1928;
  undefined4 uStack_1924;
  undefined4 uStack_1920;
  undefined4 uStack_191c;
  BBox1f local_1918;
  BBox1f BStack_1910;
  BBox1f local_1908;
  NodeRecordMB4D *local_18f0;
  PrimRefVector lprims_1;
  PrimRefVector lprims;
  undefined8 local_18d8;
  undefined1 local_18d0 [8];
  anon_class_1_0_00000001 reduction;
  vbool vSplitMask;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1828;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1818;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1808;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17e8;
  BBox1f local_17d8;
  BBox1f BStack_17d0;
  size_t local_17c8;
  size_t sStack_17c0;
  float local_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  vint vSplitPos;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1798;
  intrusive_list_node *local_1788;
  intrusive_list_node *piStack_1780;
  atomic<tbb::detail::r1::tbb_exception_ptr_*> local_1778;
  void *pvStack_1770;
  string_resource_index local_1768;
  char acStack_1760 [24];
  BBox1f local_1748;
  BBox1f BStack_1740;
  BBox1f local_1738;
  BBox1f BStack_1730;
  float local_1728;
  float fStack_1724;
  undefined4 uStack_1720;
  undefined4 uStack_171c;
  BBox1f local_1718;
  BBox1f BStack_1710;
  BBox1f local_1708;
  BBox1f time_range1;
  anon_class_1_0_00000001 reduction2;
  undefined4 uStack_16c4;
  anon_class_1_0_00000001 reduction2_1;
  undefined1 local_1618 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_15f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_15e8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_15d8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_15c8;
  BBox1f local_15b8;
  unsigned_long uStack_15b0;
  size_t local_15a8;
  size_t local_15a0;
  BBox1f local_1598;
  BBox1f BStack_1590;
  undefined8 local_1588;
  ulong uStack_1580;
  BBox1f local_1578;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1568;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  BBox1f local_1518;
  unsigned_long uStack_1510;
  BBox1f local_1508;
  size_t sStack_1500;
  BBox1f local_14f8;
  size_t sStack_14f0;
  BBox1f local_14e8;
  undefined8 uStack_14e0;
  BBox1f local_14d8;
  vint vSplitPos_1;
  BBox1f time_range0;
  anon_union_4_2_620955e9_for_BinSplit<32UL>_3 local_1440;
  float fStack_143c;
  Split csplit;
  Lock<embree::MutexSys> lock;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_13b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_13a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1398;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1388;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1378;
  BBox1f local_1368;
  unsigned_long uStack_1360;
  BBox1f local_1358;
  BBox1f BStack_1350;
  float local_1348 [2];
  undefined8 uStack_1340;
  BBox1f local_1338;
  undefined8 uStack_1330;
  BBox1f local_1328 [2];
  MutexSys *local_1318;
  size_t local_1308;
  undefined8 uStack_1300;
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float local_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_12d8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_12c8;
  float local_12b8;
  float fStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  size_t local_12a8;
  size_t local_12a0;
  BBox1f local_1298;
  BBox1f BStack_1290;
  undefined8 local_1288;
  ulong uStack_1280;
  BBox1f local_1278;
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  long local_838;
  BBox1f local_830;
  undefined8 local_828;
  BBox1f BStack_648;
  long local_640;
  NodeRecordMB4D values [16];
  
  local_18f0 = __return_storage_ptr__;
  if (alloc.alloc == (FastAllocator *)0x0) {
    alloc.alloc = (this->createAlloc).super_Create.allocator;
    plVar16 = (long *)__tls_get_addr(&PTR_021a7d38);
    this_00 = (MutexSys *)*plVar16;
    if (this_00 == (MutexSys *)0x0) {
      this_00 = (MutexSys *)alignedMalloc(0xc0,0x40);
      MutexSys::MutexSys(this_00);
      this_00[1].mutex = (void *)0x0;
      this_00[8].mutex = this_00;
      this_00[9].mutex = (void *)0x0;
      this_00[10].mutex = (void *)0x0;
      this_00[0xb].mutex = (void *)0x0;
      this_00[0xc].mutex = (void *)0x0;
      this_00[0xd].mutex = (void *)0x0;
      this_00[0xe].mutex = (void *)0x0;
      this_00[0x10].mutex = this_00;
      this_00[0x11].mutex = (void *)0x0;
      this_00[0x12].mutex = (void *)0x0;
      this_00[0x13].mutex = (void *)0x0;
      this_00[0x14].mutex = (void *)0x0;
      this_00[0x15].mutex = (void *)0x0;
      this_00[0x16].mutex = (void *)0x0;
      *plVar16 = (long)this_00;
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      values[0].ref.ptr = (size_t)this_00;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)values);
      if (values[0].ref.ptr != 0) {
        std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                  ((default_delete<embree::FastAllocator::ThreadLocal2> *)values,
                   (ThreadLocal2 *)values[0].ref.ptr);
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    }
    alloc.talloc0 = (ThreadLocal *)(this_00 + 8);
    alloc.talloc1 = (ThreadLocal *)(this_00 + 0x10);
    if ((alloc.alloc)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
  }
  if ((toplevel) &&
     (uVar17 = (current->prims).super_PrimInfoMB.object_range._end -
               (current->prims).super_PrimInfoMB.object_range._begin,
     uVar17 <= (this->cfg).singleThreadThreshold)) {
    auVar39._8_4_ = (int)(uVar17 >> 0x20);
    auVar39._0_8_ = uVar17;
    auVar39._12_4_ = 0x45300000;
    Scene::progressMonitor
              ((this->progressMonitor).scene,
               (auVar39._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0));
  }
  local_19d0 = &current->prims;
  find(&csplit,this,local_19d0);
  set = local_19d0;
  bVar3 = (byte)(this->cfg).logBlockSize;
  sVar23 = (current->prims).super_PrimInfoMB.object_range._end;
  BVar26 = (BBox1f)(current->prims).super_PrimInfoMB.object_range._begin;
  uVar17 = sVar23 - (long)BVar26;
  if ((uVar17 <= (this->cfg).minLeafSize) || ((this->cfg).maxDepth <= current->depth + 8)) {
LAB_00c71de8:
    SetMB::deterministic_order(local_19d0);
    pNVar14 = local_18f0;
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    createLargeLeaf(local_18f0,this,current,alloc_00);
    return pNVar14;
  }
  fVar52 = (current->prims).super_PrimInfoMB.time_range.upper;
  fVar40 = (current->prims).super_PrimInfoMB.time_range.lower;
  if ((uVar17 <= (this->cfg).maxLeafSize) &&
     (fVar42 = (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.upper.field_0.m128[1] -
               (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.lower.field_0.m128[1],
     fVar43 = (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
              geomBounds.bounds0.upper.field_0.m128[2] -
              (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
              geomBounds.bounds0.lower.field_0.m128[2],
     fVar44 = (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
              geomBounds.bounds1.upper.field_0.m128[1] -
              (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
              geomBounds.bounds1.lower.field_0.m128[1],
     fVar45 = (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
              geomBounds.bounds1.upper.field_0.m128[2] -
              (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
              geomBounds.bounds1.lower.field_0.m128[2],
     fVar43 = ((fVar44 + fVar45) *
               ((current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.upper.field_0.m128[0] -
               (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.lower.field_0.m128[0]) + fVar45 * fVar44 +
              (fVar42 + fVar43) *
              ((current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.upper.field_0.m128[0] -
              (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
              geomBounds.bounds0.lower.field_0.m128[0]) + fVar43 * fVar42) * 0.5 * (fVar52 - fVar40)
     , fVar42 = (this->cfg).intCost,
     (float)(~(-1L << (bVar3 & 0x3f)) + (current->prims).super_PrimInfoMB.num_time_segments >>
            (bVar3 & 0x3f)) * fVar43 * fVar42 <= fVar43 * (this->cfg).travCost + fVar42 * csplit.sah
     )) goto LAB_00c71de8;
  if (csplit.data == 0) {
    lock.mutex = (MutexSys *)0x7f8000007f800000;
    lock.locked = false;
    lock._9_7_ = 0x7f8000007f8000;
    local_13b8._0_8_ = 0xff800000ff800000;
    local_13b8._8_8_ = 0xff800000ff800000;
    local_13a8._0_8_ = 0x7f8000007f800000;
    local_13a8._8_8_ = 0x7f8000007f800000;
    local_1398._0_8_ = 0xff800000ff800000;
    local_1398._8_8_ = 0xff800000ff800000;
    local_1388._0_8_ = 0x7f8000007f800000;
    local_1388._8_8_ = 0x7f8000007f800000;
    local_1378._0_8_ = 0xff800000ff800000;
    local_1378._8_8_ = 0xff800000ff800000;
    local_1368.lower = 0.0;
    local_1368.upper = 0.0;
    uStack_1360 = 0;
    local_1358.lower = 0.0;
    local_1358.upper = 0.0;
    BStack_1350.lower = 0.0;
    BStack_1350.upper = 0.0;
    local_1348[0] = 0.0;
    local_1348[1] = 1.0;
    uStack_1340._0_4_ = 1.0;
    uStack_1340._4_4_ = 0.0;
    values[0].ref.ptr = 0x7f8000007f800000;
    values[0]._8_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds0.lower.field_0._0_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds0.lower.field_0._8_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds0.upper.field_0._0_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds0.upper.field_0._8_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds1.lower.field_0._0_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds1.lower.field_0._8_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds1.upper.field_0._0_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds1.upper.field_0._8_8_ = 0x7f8000007f800000;
    values[0].dt.lower = -INFINITY;
    values[0].dt.upper = -INFINITY;
    values[0]._88_8_ = 0xff800000ff800000;
    values[1].ref.ptr = 0;
    values[1]._8_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._0_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._8_8_ = 0;
    values[1].lbounds.bounds0.upper.field_0.m128[0] = 0.0;
    values[1].lbounds.bounds0.upper.field_0.m128[1] = 1.0;
    values[1].lbounds.bounds0.upper.field_0.m128[2] = 1.0;
    values[1].lbounds.bounds0.upper.field_0.m128[3] = 0.0;
    isLeft.vSplitPos = &vSplitPos;
    vSplitPos.field_0.i[1] = csplit.field_2.pos;
    vSplitPos.field_0.i[0] = (int)csplit.field_2;
    vSplitPos.field_0.i[3] = csplit.field_2.pos;
    vSplitPos.field_0.i[2] = (int)csplit.field_2;
    lVar25 = (long)(1 << ((byte)csplit.dim & 0x1f)) * 0x10;
    vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar25);
    vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar25 + 8);
    isLeft.vSplitMask = &vSplitMask;
    isLeft.split = &csplit;
    local_15a8 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                           (((current->prims).prims)->items,(size_t)BVar26,sVar23,
                            (EmptyTy *)&vSplitPos_1,
                            (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lock,
                            (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,&isLeft,&reduction
                            ,&reduction2,0x80,0xc00);
    local_1578 = (BBox1f)(current->prims).prims;
    BVar28 = (current->prims).super_PrimInfoMB.time_range;
    local_1568._0_8_ = lock.mutex;
    local_1568._8_8_ = lock._8_8_;
    local_1558 = local_13b8._0_8_;
    uStack_1550 = local_13b8._8_8_;
    local_1548 = local_13a8._0_8_;
    uStack_1540 = local_13a8._8_8_;
    local_1538 = local_1398._0_8_;
    uStack_1530 = local_1398._8_8_;
    local_1528 = local_1388._0_8_;
    uStack_1520 = local_1388._8_8_;
    local_1518.lower = local_1378.m128[0];
    local_1518.upper = local_1378.m128[1];
    uStack_1510 = local_1378._8_8_;
    local_14f8 = local_1358;
    sStack_14f0._0_4_ = BStack_1350.lower;
    sStack_14f0._4_4_ = BStack_1350.upper;
    local_14e8.upper = local_1348[1];
    local_14e8.lower = local_1348[0];
    fVar40 = BVar28.lower;
    fVar52 = fVar40;
    if (fVar40 <= (float)uStack_1340) {
      fVar52 = (float)uStack_1340;
    }
    fVar42 = BVar28.upper;
    if (fVar42 <= uStack_1340._4_4_) {
      uStack_1340._4_4_ = fVar42;
    }
    uStack_14e0 = CONCAT44(uStack_1340._4_4_,fVar52);
    local_1618._16_8_ = values[0].ref.ptr;
    local_1618._24_8_ = values[0]._8_8_;
    local_15f8._0_8_ = values[0].lbounds.bounds0.lower.field_0._0_8_;
    local_15f8._8_8_ = values[0].lbounds.bounds0.lower.field_0._8_8_;
    local_15e8._0_8_ = values[0].lbounds.bounds0.upper.field_0._0_8_;
    local_15e8._8_8_ = values[0].lbounds.bounds0.upper.field_0._8_8_;
    local_15d8._8_8_ = values[0].lbounds.bounds1.lower.field_0._8_8_;
    local_15d8._0_8_ = values[0].lbounds.bounds1.lower.field_0._0_8_;
    local_15c8._8_8_ = values[0].lbounds.bounds1.upper.field_0._8_8_;
    local_15c8._0_8_ = values[0].lbounds.bounds1.upper.field_0._0_8_;
    local_15b8 = values[0].dt;
    uStack_15b0 = values[0]._88_8_;
    local_1588 = CONCAT44(values[1].lbounds.bounds0.upper.field_0.m128[1],
                          values[1].lbounds.bounds0.upper.field_0.m128[0]);
    local_1598.lower = (float)values[1].lbounds.bounds0.lower.field_0._0_4_;
    local_1598.upper = (float)values[1].lbounds.bounds0.lower.field_0._4_4_;
    BStack_1590.lower = (float)values[1].lbounds.bounds0.lower.field_0._8_4_;
    BStack_1590.upper = (float)values[1].lbounds.bounds0.lower.field_0._12_4_;
    if (fVar40 <= (float)values[1].lbounds.bounds0.upper.field_0._8_4_) {
      BVar28.upper = 0.0;
      BVar28.lower = (float)values[1].lbounds.bounds0.upper.field_0._8_4_;
    }
    uVar4 = values[1].lbounds.bounds0.upper.field_0.m128[3];
    if (fVar42 <= (float)values[1].lbounds.bounds0.upper.field_0._12_4_) {
      uVar4 = fVar42;
    }
    uStack_1580 = CONCAT44(uVar4,BVar28.lower);
    local_15a0 = sVar23;
    local_1508 = BVar26;
    sStack_1500 = local_15a8;
    local_14d8 = local_1578;
LAB_00c72101:
    uVar17 = 0;
    local_12b8 = local_15b8.lower;
    fStack_12b4 = local_15b8.upper;
    uStack_12b0 = (undefined4)uStack_15b0;
    uStack_12ac = uStack_15b0._4_4_;
    local_12f8 = local_15f8.m128[0];
    fStack_12f4 = local_15f8.m128[1];
    fStack_12f0 = local_15f8.m128[2];
    fStack_12ec = local_15f8.m128[3];
    local_12e8 = local_15e8.m128[0];
    fStack_12e4 = local_15e8.m128[1];
    fStack_12e0 = local_15e8.m128[2];
    fStack_12dc = local_15e8.m128[3];
  }
  else {
    if (csplit.data != 2) {
      if (csplit.data == 1) {
        SetMB::deterministic_order(local_19d0);
        splitFallback(this,set,(SetMB *)&local_1568.field_1,(SetMB *)(local_1618 + 0x10));
      }
      else if (csplit.data == 3) {
        SetMB::deterministic_order(local_19d0);
        splitByGeometry(this,set,(SetMB *)&local_1568.field_1,(SetMB *)(local_1618 + 0x10));
      }
      goto LAB_00c72101;
    }
    time_range0.upper = csplit.field_2.fpos;
    time_range1.upper = fVar52;
    time_range1.lower = csplit.field_2.fpos;
    BVar28 = (BBox1f)(current->prims).prims;
    time_range0.lower = fVar40;
    pmVar18 = (PrimRefVector)operator_new(0x28);
    pMVar5 = (this->heuristicTemporalSplit).device;
    (pmVar18->alloc).device = pMVar5;
    (pmVar18->alloc).hugepages = false;
    uVar31 = uVar17 * 0x50;
    pmVar18->size_active = 0;
    pmVar18->size_alloced = 0;
    pmVar18->items = (PrimRefMB *)0x0;
    (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,uVar31,0);
    if (uVar31 < 0x1c00000) {
      pPVar19 = (PrimRefMB *)alignedMalloc(uVar31,0x10);
    }
    else {
      pPVar19 = (PrimRefMB *)os_malloc(uVar31,&(pmVar18->alloc).hugepages);
    }
    local_1828._0_8_ = &this->heuristicTemporalSplit;
    pmVar18->items = pPVar19;
    pmVar18->size_active = uVar17;
    pmVar18->size_alloced = uVar17;
    local_1828._8_8_ = &lprims;
    local_1818._0_8_ = local_19d0;
    pSVar10 = (Split *)(current->prims).super_PrimInfoMB.object_range._begin;
    pvVar12 = (vint *)(current->prims).super_PrimInfoMB.object_range._end;
    values[0].ref.ptr = 0x7f8000007f800000;
    values[0]._8_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds0.lower.field_0._0_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds0.lower.field_0._8_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds0.upper.field_0._0_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds0.upper.field_0._8_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds1.lower.field_0._0_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds1.lower.field_0._8_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds1.upper.field_0._0_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds1.upper.field_0._8_8_ = 0x7f8000007f800000;
    values[0].dt.lower = -INFINITY;
    values[0].dt.upper = -INFINITY;
    values[0]._88_8_ = 0xff800000ff800000;
    values[1].ref.ptr = 0;
    values[1]._8_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._0_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._8_8_ = 0;
    values[1].lbounds.bounds0.upper.field_0.m128[0] = 0.0;
    values[1].lbounds.bounds0.upper.field_0.m128[1] = 1.0;
    values[1].lbounds.bounds0.upper.field_0.m128[2] = 1.0;
    values[1].lbounds.bounds0.upper.field_0.m128[3] = 0.0;
    local_1a20 = pmVar18;
    lprims = pmVar18;
    vSplitMask.field_0._0_8_ = BVar28;
    vSplitMask.field_0._8_8_ = &time_range0;
    if ((ulong)((long)pvVar12 - (long)pSVar10) < 0xc00) {
      isLeft.split = pSVar10;
      isLeft.vSplitPos = pvVar12;
      ::anon_func::anon_class_40_5_808acc65::operator()
                ((PrimInfoMB *)&lock,(anon_class_40_5_808acc65 *)&vSplitMask,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
      tbb::detail::r1::initialize((task_group_context *)&isLeft);
      local_1798._0_8_ = (BBox1f *)0x80;
      _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      vSplitPos.field_0.v[0] = (longlong)pvVar12;
      vSplitPos.field_0.v[1] = (longlong)pSVar10;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lock,(d1 *)&vSplitPos,
                 (blocked_range<unsigned_long> *)values,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                 (anon_class_16_2_ed117de8_conflict29 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&isLeft,in_stack_ffffffffffffe5c8);
      cVar15 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar15 != '\0') {
        prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar24,"task cancelled");
        __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&isLeft);
    }
    uVar33 = (current->prims).super_PrimInfoMB.object_range._begin;
    pBVar27 = (BBox1f *)(current->prims).super_PrimInfoMB.object_range._end;
    uVar17 = (long)pBVar27 - uVar33;
    if (uStack_1360 - (long)local_1368 != uVar17) {
      values[0].ref.ptr = (size_t)&time_range0;
      uStack_1360 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                              (lprims->items,0,uVar17,0x400,(anon_class_8_1_41ce32a5 *)values);
      uVar33 = (current->prims).super_PrimInfoMB.object_range._begin;
      pBVar27 = (BBox1f *)(current->prims).super_PrimInfoMB.object_range._end;
      uVar17 = (long)pBVar27 - uVar33;
    }
    local_14f8 = local_1358;
    sStack_14f0._0_4_ = BStack_1350.lower;
    sStack_14f0._4_4_ = BStack_1350.upper;
    local_1568._0_8_ = lock.mutex;
    local_1568._8_8_ = lock._8_8_;
    local_1558 = local_13b8._0_8_;
    uStack_1550 = local_13b8._8_8_;
    local_1548 = local_13a8._0_8_;
    uStack_1540 = local_13a8._8_8_;
    local_1538 = local_1398._0_8_;
    uStack_1530 = local_1398._8_8_;
    local_1528 = local_1388._0_8_;
    uStack_1520 = local_1388._8_8_;
    local_1518.lower = local_1378.m128[0];
    local_1518.upper = local_1378.m128[1];
    uStack_1510 = local_1378._8_8_;
    local_14e8.upper = local_1348[1];
    local_14e8.lower = local_1348[0];
    uStack_14e0 = CONCAT44(~-(uint)(uStack_1340._4_4_ < time_range0.upper) & (uint)time_range0.upper
                           ,~-(uint)((float)uStack_1340 < time_range0.lower) &
                            (uint)(float)uStack_1340) |
                  CONCAT44((uint)uStack_1340._4_4_ & -(uint)(uStack_1340._4_4_ < time_range0.upper),
                           (uint)time_range0.lower & -(uint)((float)uStack_1340 < time_range0.lower)
                          );
    local_14d8 = (BBox1f)lprims;
    isLeft.split = (Split *)0x7f8000007f800000;
    isLeft.vSplitPos = (vint *)0x7f8000007f800000;
    isLeft.vSplitMask = (vbool *)0xff800000ff800000;
    uStack_1990 = 0xff800000ff800000;
    local_1988._0_8_ = (Lock<embree::MutexSys> *)0x7f8000007f800000;
    local_1988._8_8_ = (PrimRefVector *)0x7f8000007f800000;
    local_1978._0_8_ = (SetMB *)0xff800000ff800000;
    local_1978._8_8_ = 0xff800000ff800000;
    local_1968._8_8_ = 0x7f8000007f800000;
    local_1968._0_8_ = 0x7f8000007f800000;
    local_1958.lower = -INFINITY;
    local_1958.upper = -INFINITY;
    acStack_1950[0] = '\0';
    acStack_1950[1] = '\0';
    acStack_1950[2] = -0x80;
    acStack_1950[3] = -1;
    acStack_1950[4] = '\0';
    acStack_1950[5] = '\0';
    acStack_1950[6] = -0x80;
    acStack_1950[7] = -1;
    local_1948.lower = 0.0;
    local_1948.upper = 0.0;
    BStack_1940.lower = 0.0;
    BStack_1940.upper = 0.0;
    local_1938.lower = 0.0;
    local_1938.upper = 0.0;
    BStack_1930.lower = 0.0;
    BStack_1930.upper = 0.0;
    local_1928 = 0;
    uStack_1924 = 0x3f800000;
    uStack_1920 = 0x3f800000;
    uStack_191c = 0;
    _reduction2 = BVar28;
    local_1508 = local_1368;
    sStack_1500 = uStack_1360;
    if (uVar17 < 0xc00) {
      vSplitPos.field_0.v[0] = uVar33;
      vSplitPos.field_0.v[1] = (longlong)pBVar27;
      ::anon_func::anon_class_24_3_35f68c7c::operator()
                ((PrimInfoMB *)values,(anon_class_24_3_35f68c7c *)&reduction2,
                 (range<unsigned_long> *)&vSplitPos);
    }
    else {
      vSplitPos.field_0.v[1]._4_2_ = 0x401;
      local_1788 = (intrusive_list_node *)0x0;
      piStack_1780 = (intrusive_list_node *)0x0;
      local_1768 = CUSTOM_CTX;
      tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
      vSplitPos_1.field_0.v[0] = (longlong)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      vSplitPos_1.field_0.v[1] = (longlong)&reduction2;
      _reduction = (code *)pBVar27;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&isLeft,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitPos_1,
                 (anon_class_16_2_ed117de8_conflict30 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&vSplitPos,in_stack_ffffffffffffe5c8);
      cVar15 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
      if (cVar15 != '\0') {
        prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar24,"task cancelled");
        __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
    }
    lVar25 = values[1]._8_8_ - values[1].ref.ptr;
    values[1].ref.ptr = (current->prims).super_PrimInfoMB.object_range._begin;
    local_15a0 = lVar25 + values[1].ref.ptr;
    values[1]._8_8_ = local_15a0;
    uVar33 = (current->prims).super_PrimInfoMB.object_range._end;
    if (lVar25 != uVar33 - values[1].ref.ptr) {
      isLeft.split = (Split *)&time_range1;
      local_15a0 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                             ((PrimRefMB *)
                              ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar28 + 0x20))->
                              reduction,values[1].ref.ptr,uVar33,0x400,
                              (anon_class_8_1_41ce32a6 *)&isLeft);
      values[1]._8_8_ = local_15a0;
    }
    local_1618._16_8_ = values[0].ref.ptr;
    local_1618._24_8_ = values[0]._8_8_;
    local_15d8._8_8_ = values[0].lbounds.bounds1.lower.field_0._8_8_;
    local_15d8._0_8_ = values[0].lbounds.bounds1.lower.field_0._0_8_;
    local_15c8._8_8_ = values[0].lbounds.bounds1.upper.field_0._8_8_;
    local_15c8._0_8_ = values[0].lbounds.bounds1.upper.field_0._0_8_;
    local_1598.lower = (float)values[1].lbounds.bounds0.lower.field_0._0_4_;
    local_1598.upper = (float)values[1].lbounds.bounds0.lower.field_0._4_4_;
    BStack_1590.lower = (float)values[1].lbounds.bounds0.lower.field_0._8_4_;
    BStack_1590.upper = (float)values[1].lbounds.bounds0.lower.field_0._12_4_;
    local_15f8._0_8_ = values[0].lbounds.bounds0.lower.field_0._0_8_;
    local_15f8._8_8_ = values[0].lbounds.bounds0.lower.field_0._8_8_;
    local_15e8._0_8_ = values[0].lbounds.bounds0.upper.field_0._0_8_;
    local_15e8._8_8_ = values[0].lbounds.bounds0.upper.field_0._8_8_;
    local_15b8 = values[0].dt;
    uStack_15b0 = values[0]._88_8_;
    local_1588 = CONCAT44(values[1].lbounds.bounds0.upper.field_0.m128[1],
                          values[1].lbounds.bounds0.upper.field_0.m128[0]);
    uVar35 = -(uint)((float)values[1].lbounds.bounds0.upper.field_0._8_4_ < time_range1.lower);
    uVar36 = -(uint)((float)values[1].lbounds.bounds0.upper.field_0._12_4_ < time_range1.upper);
    uStack_1580 = CONCAT44(~uVar36 & (uint)time_range1.upper,
                           ~uVar35 & values[1].lbounds.bounds0.upper.field_0.m128[2]) |
                  CONCAT44(values[1].lbounds.bounds0.upper.field_0.m128[3] & uVar36,
                           (uint)time_range1.lower & uVar35);
    uVar17 = CONCAT71(BVar26._1_7_,local_1a20 != (PrimRefVector)0x0);
    local_12b8 = values[0].dt.lower;
    fStack_12b4 = values[0].dt.upper;
    uStack_12b0 = values[0]._88_4_;
    uStack_12ac = values[0]._92_4_;
    local_12f8 = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
    fStack_12f4 = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
    fStack_12f0 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
    fStack_12ec = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
    local_12e8 = (float)values[0].lbounds.bounds0.upper.field_0._0_4_;
    fStack_12e4 = (float)values[0].lbounds.bounds0.upper.field_0._4_4_;
    fStack_12e0 = (float)values[0].lbounds.bounds0.upper.field_0._8_4_;
    fStack_12dc = (float)values[0].lbounds.bounds0.upper.field_0._12_4_;
    local_15a8 = values[1].ref.ptr;
    local_1578 = BVar28;
    values[1]._8_8_ = local_15a0;
  }
  lVar25 = 1;
  local_640 = 1;
  local_840 = (BBox1f)(current->prims).prims;
  local_1a20 = (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                *)0x0;
  if (local_14d8 == local_840) {
    local_838 = 3;
    local_8c8[0] = &local_840;
  }
  else {
    local_640 = 2;
    local_830 = local_14d8;
    local_828 = 1;
    local_838 = 2;
    lVar25 = 2;
    local_8c8[0] = &local_830;
  }
  lock.mutex = (MutexSys *)(current->depth + 1);
  if (local_1578 == local_840) {
    local_8c8[1] = &local_840;
  }
  else {
    local_640 = lVar25 + 1;
    uVar31 = (ulong)(uint)((int)lVar25 << 4);
    *(BBox1f *)((long)&local_840.lower + uVar31) = local_1578;
    *(undefined8 *)((long)&local_838 + uVar31) = 1;
    local_8c8[1] = (BBox1f *)((long)&local_840.lower + uVar31);
    local_838 = local_838 + -1;
  }
  local_13b8._0_8_ = local_1568._0_8_;
  local_13b8._8_8_ = local_1568._8_8_;
  local_13a8._0_8_ = local_1558;
  local_13a8._8_8_ = uStack_1550;
  local_1398._0_8_ = local_1548;
  local_1398._8_8_ = uStack_1540;
  local_1388._0_8_ = local_1538;
  local_1388._8_8_ = uStack_1530;
  local_1378._0_8_ = local_1528;
  local_1378._8_8_ = uStack_1520;
  local_1368 = local_1518;
  uStack_1360 = uStack_1510;
  local_1358 = local_1508;
  BStack_1350.lower = (float)(undefined4)sStack_1500;
  BStack_1350.upper = (float)sStack_1500._4_4_;
  local_1348[0] = local_14f8.lower;
  local_1348[1] = local_14f8.upper;
  uStack_1340._0_4_ = (float)sStack_14f0;
  uStack_1340._4_4_ = (float)(sStack_14f0 >> 0x20);
  local_1338 = local_14e8;
  uStack_1330 = uStack_14e0;
  local_1328[0] = local_14d8;
  local_1318 = lock.mutex;
  local_1308 = local_1618._16_8_;
  uStack_1300 = local_1618._24_8_;
  local_12d8 = local_15d8;
  local_12c8 = local_15c8;
  local_12a8 = local_15a8;
  local_12a0 = local_15a0;
  local_1298 = local_1598;
  BStack_1290 = BStack_1590;
  local_1288 = local_1588;
  uStack_1280 = uStack_1580;
  local_1278 = local_1578;
  local_848 = 2;
  if (2 < (this->cfg).branchingFactor) {
    local_1a08 = &this->heuristicTemporalSplit;
    local_19e8._0_8_ = &local_1928;
    local_19c8._0_8_ = &local_1728;
    do {
      if (local_848 == 0) break;
      uVar31 = 0xffffffffffffffff;
      pBVar27 = &BStack_1350;
      fVar52 = -INFINITY;
      uVar30 = 0;
      do {
        if (((this->cfg).minLeafSize < (ulong)(*(long *)pBVar27 - ((long *)pBVar27)[-1])) &&
           (fVar42 = *(float *)((long)((long *)pBVar27 + -0xb) + 4) -
                     *(float *)((long)((long *)pBVar27 + -0xd) + 4),
           fVar40 = *(float *)((long)((long *)pBVar27 + -7) + 4) -
                    *(float *)((long)((long *)pBVar27 + -9) + 4),
           fVar40 = ((*(float *)((long *)pBVar27 + -7) - *(float *)((long *)pBVar27 + -9)) *
                     (fVar40 + (*(float *)((long *)pBVar27 + -6) - *(float *)((long *)pBVar27 + -8))
                     ) + (*(float *)((long *)pBVar27 + -6) - *(float *)((long *)pBVar27 + -8)) *
                         fVar40 +
                    (*(float *)((long *)pBVar27 + -0xb) - *(float *)((long *)pBVar27 + -0xd)) *
                    (fVar42 + (*(float *)((long *)pBVar27 + -10) -
                              *(float *)((long *)pBVar27 + -0xc))) +
                    (*(float *)((long *)pBVar27 + -10) - *(float *)((long *)pBVar27 + -0xc)) *
                    fVar42) * 0.5, fVar52 < fVar40)) {
          uVar31 = uVar30;
          fVar52 = fVar40;
        }
        uVar30 = uVar30 + 1;
        pBVar27 = (BBox1f *)((long *)pBVar27 + 0x16);
      } while (local_848 != uVar30);
      if (uVar31 == 0xffffffffffffffff) break;
      local_1a18.m128[0] = (float)(int)uVar17;
      local_19f8._0_8_ = uVar31;
      isLeft.split = (Split *)(current->depth + 1);
      paVar21 = &local_13b8 + uVar31 * 0xb;
      vSplitPos.field_0.v[0] = (longlong)isLeft.split;
      find((Split *)&time_range0,this,(SetMB *)&paVar21->field_1);
      if (fStack_143c == 0.0) {
        local_1938 = (&local_1358)[uVar31 * 0x16];
        BVar28 = (&local_1358)[uVar31 * 0x16 + 1];
        vSplitMask.field_0._0_8_ = 0x7f8000007f800000;
        vSplitMask.field_0._8_8_ = 0x7f8000007f800000;
        local_1828._0_8_ = (Lock<embree::MutexSys> *)0xff800000ff800000;
        local_1828._8_8_ = (PrimRefVector *)0xff800000ff800000;
        local_1818._0_8_ = (SetMB *)0x7f8000007f800000;
        local_1818._8_8_ = 0x7f8000007f800000;
        local_1808._0_8_ = 0xff800000ff800000;
        local_1808._8_8_ = 0xff800000ff800000;
        local_17f8.m128[0] = INFINITY;
        local_17f8.m128[1] = INFINITY;
        local_17f8._8_8_ = 0x7f8000007f800000;
        local_17e8.m128[0] = -INFINITY;
        local_17e8.m128[1] = -INFINITY;
        local_17e8.m128[2] = -INFINITY;
        local_17e8.m128[3] = -INFINITY;
        local_17b8 = 0.0;
        local_17c8 = 0;
        sStack_17c0 = 0;
        local_17d8.lower = 0.0;
        local_17d8.upper = 0.0;
        BStack_17d0.lower = 0.0;
        BStack_17d0.upper = 0.0;
        fStack_17b4 = 1.0;
        fStack_17b0 = 1.0;
        fStack_17ac = 0.0;
        _reduction = (code *)0x7f8000007f800000;
        vSplitPos_1.field_0.i[1] = local_1440.pos;
        vSplitPos_1.field_0.i[0] = (int)local_1440;
        vSplitPos_1.field_0._12_4_ = local_1440.pos;
        vSplitPos_1.field_0._8_4_ = local_1440;
        time_range1 = *(BBox1f *)
                       (mm_lookupmask_ps + (long)(1 << (time_range0.upper._0_1_ & 0x1f)) * 0x10);
        _reduction2 = &time_range0;
        BStack_1930 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                        (*(PrimRefMB **)((long)local_1328[uVar31 * 0x16] + 0x20),
                                         (size_t)local_1938,(size_t)BVar28,(EmptyTy *)local_1618,
                                         (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,
                                         (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                                         (anon_class_24_3_c5d13451 *)&reduction2,
                                         (anon_class_1_0_00000001 *)&lprims,&reduction2_1,0x80,0xc00
                                        );
        local_1908 = local_1328[uVar31 * 0x16];
        BVar26 = local_1328[uVar31 * 0x16 + -1];
        local_1968._8_8_ = 0xff800000ff800000;
        local_1968._0_8_ = 0xff800000ff800000;
        isLeft.vSplitMask = (vbool *)vSplitMask.field_0._0_8_;
        uStack_1990 = vSplitMask.field_0._8_8_;
        local_1988._0_8_ = (Lock<embree::MutexSys> *)0xff800000ff800000;
        local_1988._8_8_ = (PrimRefVector *)0xff800000ff800000;
        local_1978._0_8_ = (SetMB *)0x7f8000007f800000;
        local_1978._8_8_ = 0x7f8000007f800000;
        local_1958.lower = INFINITY;
        local_1958.upper = INFINITY;
        acStack_1950[0] = '\0';
        acStack_1950[1] = '\0';
        acStack_1950[2] = -0x80;
        acStack_1950[3] = '\x7f';
        acStack_1950[4] = '\0';
        acStack_1950[5] = '\0';
        acStack_1950[6] = -0x80;
        acStack_1950[7] = '\x7f';
        local_1948.lower = -INFINITY;
        local_1948.upper = -INFINITY;
        BStack_1940.lower = -INFINITY;
        BStack_1940.upper = -INFINITY;
        *(undefined8 *)(local_19e8._0_8_ + 0x10) = 0x3f80000000000000;
        *(undefined8 *)(local_19e8._0_8_ + 0x18) = 0x3f800000;
        *(undefined8 *)local_19e8._0_8_ = 0;
        *(undefined8 *)(local_19e8._0_8_ + 8) = 0;
        fVar40 = BVar26.lower;
        fVar52 = fVar40;
        if (fVar40 <= BStack_1910.lower) {
          fVar52 = BStack_1910.lower;
        }
        fVar42 = BVar26.upper;
        if (fVar42 <= BStack_1910.upper) {
          BStack_1910.upper = fVar42;
        }
        BStack_1910.lower = fVar52;
        local_1798._0_8_ = _reduction;
        local_1798._8_8_ = 0x7f8000007f800000;
        local_1788 = (intrusive_list_node *)0xff800000ff800000;
        piStack_1780 = (intrusive_list_node *)0xff800000ff800000;
        local_1778._M_b._M_p = (__base_type)(__pointer_type)0x7f8000007f800000;
        pvStack_1770 = (void *)0x7f8000007f800000;
        local_1768 = 0xff800000ff800000;
        acStack_1760[0] = '\0';
        acStack_1760[1] = '\0';
        acStack_1760[2] = -0x80;
        acStack_1760[3] = -1;
        acStack_1760[4] = '\0';
        acStack_1760[5] = '\0';
        acStack_1760[6] = -0x80;
        acStack_1760[7] = -1;
        acStack_1760[8] = '\0';
        acStack_1760[9] = '\0';
        acStack_1760[10] = -0x80;
        acStack_1760[0xb] = '\x7f';
        acStack_1760[0xc] = '\0';
        acStack_1760[0xd] = '\0';
        acStack_1760[0xe] = -0x80;
        acStack_1760[0xf] = '\x7f';
        acStack_1760[0x10] = '\0';
        acStack_1760[0x11] = '\0';
        acStack_1760[0x12] = -0x80;
        acStack_1760[0x13] = '\x7f';
        acStack_1760[0x14] = '\0';
        acStack_1760[0x15] = '\0';
        acStack_1760[0x16] = -0x80;
        acStack_1760[0x17] = '\x7f';
        local_1748.lower = -INFINITY;
        local_1748.upper = -INFINITY;
        BStack_1740.lower = -INFINITY;
        BStack_1740.upper = -INFINITY;
        *(undefined4 *)(local_19c8._0_8_ + 0x10) = 0;
        *(undefined4 *)(local_19c8._0_8_ + 0x14) = 0x3f800000;
        *(undefined4 *)(local_19c8._0_8_ + 0x18) = 0x3f800000;
        *(undefined4 *)(local_19c8._0_8_ + 0x1c) = 0;
        *(undefined8 *)local_19c8._0_8_ = 0;
        *(undefined8 *)(local_19c8._0_8_ + 8) = 0;
        if (fVar40 <= BStack_1710.lower) {
          BVar26 = (BBox1f)((ulong)BStack_1710 & 0xffffffff);
        }
        if (fVar42 <= BStack_1710.upper) {
          BStack_1710.upper = fVar42;
        }
        BStack_1710.lower = BVar26.lower;
        local_1738 = BStack_1930;
        BStack_1730 = BVar28;
        local_1708 = local_1908;
LAB_00c72845:
        bVar34 = false;
        uVar29 = local_19f8._0_8_;
        uVar4 = local_1a18.m128[0];
      }
      else {
        if (fStack_143c != 2.8026e-45) {
          if (fStack_143c == 1.4013e-45) {
            SetMB::deterministic_order((SetMB *)&paVar21->field_1);
            splitFallback(this,(SetMB *)&paVar21->field_1,(SetMB *)&isLeft.vSplitMask,
                          (SetMB *)&local_1798.field_1);
          }
          else if (fStack_143c == 4.2039e-45) {
            SetMB::deterministic_order((SetMB *)&paVar21->field_1);
            splitByGeometry(this,(SetMB *)&paVar21->field_1,(SetMB *)&isLeft.vSplitMask,
                            (SetMB *)&local_1798.field_1);
          }
          goto LAB_00c72845;
        }
        time_range0_1.lower = local_1328[uVar31 * 0x16 + -1].lower;
        time_range0_1.upper = local_1440.fpos;
        time_range1_1.lower = local_1440.fpos;
        time_range1_1.upper = local_1328[uVar31 * 0x16 + -1].upper;
        BVar26 = local_1328[uVar31 * 0x16];
        pmVar18 = (PrimRefVector)operator_new(0x28);
        pMVar5 = local_1a08->device;
        BVar28 = (&local_1358)[uVar31 * 0x16 + 1];
        (pmVar18->alloc).device = pMVar5;
        (pmVar18->alloc).hugepages = false;
        pmVar18->size_active = 0;
        pmVar18->size_alloced = 0;
        pmVar18->items = (PrimRefMB *)0x0;
        sVar23 = (long)BVar28 - (long)(&local_1358)[uVar31 * 0x16];
        uVar4 = local_1a18._0_4_;
        BVar20 = BVar28;
        if (sVar23 != 0) {
          uVar17 = sVar23 * 0x50;
          (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,uVar17,0);
          if (uVar17 < 0x1c00000) {
            pPVar19 = (PrimRefMB *)alignedMalloc(uVar17,0x10);
          }
          else {
            pPVar19 = (PrimRefMB *)os_malloc(uVar17,&(pmVar18->alloc).hugepages);
          }
          pmVar18->items = pPVar19;
          pmVar18->size_active = sVar23;
          pmVar18->size_alloced = sVar23;
          BVar28 = (&local_1358)[uVar31 * 0x16];
          BVar20 = (&local_1358)[uVar31 * 0x16 + 1];
        }
        _reduction = (code *)0x7f8000007f800000;
        local_1a00 = pmVar18;
        lprims_1 = pmVar18;
        time_range1 = BVar26;
        if ((ulong)((long)BVar20 - (long)BVar28) < 0xc00) {
          _reduction2 = BVar28;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    ((PrimInfoMB *)&vSplitMask,(anon_class_40_5_808acc65 *)&time_range1,
                     (range<unsigned_long> *)&reduction2);
        }
        else {
          tbb::detail::r1::initialize((task_group_context *)&reduction2);
          lprims = (PrimRefVector)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_18d8 = &time_range1;
          vSplitPos_1.field_0.v[0] = (longlong)BVar20;
          vSplitPos_1.field_0.v[1] = (longlong)BVar28;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,(d1 *)&vSplitPos_1,
                     (blocked_range<unsigned_long> *)&reduction,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lprims,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&reduction2,in_stack_ffffffffffffe5c8);
          cVar15 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&reduction2);
          if (cVar15 != '\0') {
            prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar24,"task cancelled");
            __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&reduction2);
          uVar4 = local_1a18._0_4_;
        }
        BVar28 = (&local_1358)[uVar31 * 0x16];
        BVar20 = (&local_1358)[uVar31 * 0x16 + 1];
        uVar17 = (long)BVar20 - (long)BVar28;
        if ((long)BStack_17d0 - (long)local_17d8 != uVar17) {
          _reduction = (code *)&time_range0_1;
          BStack_17d0 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                          (lprims_1->items,0,uVar17,0x400,
                                           (anon_class_8_1_41ce32a5 *)&reduction);
          BVar28 = (&local_1358)[uVar31 * 0x16];
          BVar20 = (&local_1358)[uVar31 * 0x16 + 1];
          uVar17 = (long)BVar20 - (long)BVar28;
        }
        uVar29 = vSplitPos_1.field_0.v[1];
        *(size_t *)local_19e8._0_8_ = local_17c8;
        *(size_t *)(local_19e8._0_8_ + 8) = sStack_17c0;
        isLeft.vSplitMask = (vbool *)vSplitMask.field_0._0_8_;
        uStack_1990 = vSplitMask.field_0._8_8_;
        local_1988._0_8_ = local_1828._0_8_;
        local_1988._8_8_ = local_1828._8_8_;
        local_1978._0_8_ = local_1818._0_8_;
        local_1978._8_8_ = local_1818._8_8_;
        local_1968._8_8_ = local_1808._8_8_;
        local_1968._0_8_ = local_1808._0_8_;
        local_1958.lower = local_17f8.m128[0];
        local_1958.upper = local_17f8.m128[1];
        acStack_1950[0] = local_17f8._8_1_;
        acStack_1950[1] = local_17f8._9_1_;
        acStack_1950[2] = local_17f8._10_1_;
        acStack_1950[3] = local_17f8._11_1_;
        acStack_1950[4] = local_17f8._12_1_;
        acStack_1950[5] = local_17f8._13_1_;
        acStack_1950[6] = local_17f8._14_1_;
        acStack_1950[7] = local_17f8._15_1_;
        local_1948.lower = local_17e8.m128[0];
        local_1948.upper = local_17e8.m128[1];
        BStack_1940.lower = local_17e8.m128[2];
        BStack_1940.upper = local_17e8.m128[3];
        local_1938 = local_17d8;
        local_1918.upper = fStack_17b4;
        local_1918.lower = local_17b8;
        BStack_1910 = (BBox1f)(CONCAT44(~-(uint)(fStack_17ac < time_range0_1.upper) &
                                        (uint)time_range0_1.upper,
                                        ~-(uint)(fStack_17b0 < time_range0_1.lower) &
                                        (uint)fStack_17b0) |
                              CONCAT44((uint)fStack_17ac &
                                       -(uint)(fStack_17ac < time_range0_1.upper),
                                       (uint)time_range0_1.lower &
                                       -(uint)(fStack_17b0 < time_range0_1.lower)));
        local_1908 = (BBox1f)lprims_1;
        _reduction2 = INFINITY;
        uStack_16c4 = INFINITY;
        _reduction2_1 = BVar26;
        if (uVar17 < 0xc00) {
          vSplitPos_1.field_0.v[0] = (longlong)BVar28;
          vSplitPos_1.field_0.v[1] = (longlong)BVar20;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    ((PrimInfoMB *)&reduction,(anon_class_24_3_35f68c7c *)&reduction2_1,
                     (range<unsigned_long> *)&vSplitPos_1);
        }
        else {
          vSplitPos_1.field_0.v[1]._4_1_ = 1;
          vSplitPos_1.field_0.v[1]._6_2_ = SUB82(uVar29,6);
          vSplitPos_1.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos_1);
          local_18d0 = (undefined1  [8])0x80;
          local_1618._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_1618._8_8_ = &reduction2_1;
          lprims = (PrimRefVector)BVar20;
          local_18d8 = BVar28;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,(d1 *)&lprims,
                     (blocked_range<unsigned_long> *)&reduction2,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1618,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos_1,in_stack_ffffffffffffe5c8);
          cVar15 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos_1)
          ;
          if (cVar15 != '\0') {
            prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar24,"task cancelled");
            __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos_1);
          uVar4 = local_1a18._0_4_;
        }
        BVar28 = (&local_1358)[uVar31 * 0x16];
        uVar29 = local_19f8._0_8_;
        BVar20 = BVar28;
        if ((&local_1358)[uVar31 * 0x16 + 1] != BVar28) {
          _reduction2 = &time_range1_1;
          BVar20 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                                     (*(PrimRefMB **)((long)BVar26 + 0x20),(unsigned_long)BVar28,
                                      (unsigned_long)(&local_1358)[uVar31 * 0x16 + 1],0x400,
                                      (anon_class_8_1_41ce32a6 *)&reduction2);
        }
        local_1798._0_8_ = _reduction;
        local_1798._8_8_ = 0x7f8000007f800000;
        local_1788 = (intrusive_list_node *)0xff800000ff800000;
        piStack_1780 = (intrusive_list_node *)0xff800000ff800000;
        local_1778._M_b._M_p = (__base_type)(__pointer_type)0x7f8000007f800000;
        pvStack_1770 = (void *)0x7f8000007f800000;
        local_1768 = 0xff800000ff800000;
        acStack_1760[0] = '\0';
        acStack_1760[1] = '\0';
        acStack_1760[2] = -0x80;
        acStack_1760[3] = -1;
        acStack_1760[4] = '\0';
        acStack_1760[5] = '\0';
        acStack_1760[6] = -0x80;
        acStack_1760[7] = -1;
        acStack_1760[8] = '\0';
        acStack_1760[9] = '\0';
        acStack_1760[10] = -0x80;
        acStack_1760[0xb] = '\x7f';
        acStack_1760[0xc] = '\0';
        acStack_1760[0xd] = '\0';
        acStack_1760[0xe] = -0x80;
        acStack_1760[0xf] = '\x7f';
        acStack_1760[0x10] = '\0';
        acStack_1760[0x11] = '\0';
        acStack_1760[0x12] = -0x80;
        acStack_1760[0x13] = '\x7f';
        acStack_1760[0x14] = '\0';
        acStack_1760[0x15] = '\0';
        acStack_1760[0x16] = -0x80;
        acStack_1760[0x17] = '\x7f';
        local_1748.lower = -INFINITY;
        local_1748.upper = -INFINITY;
        BStack_1740.lower = -INFINITY;
        BStack_1740.upper = -INFINITY;
        *(undefined8 *)local_19c8._0_8_ = 0;
        *(undefined8 *)(local_19c8._0_8_ + 8) = 0;
        local_1718.lower = 0.0;
        local_1718.upper = 1.0;
        BStack_1710 = (BBox1f)(CONCAT44(~-(uint)(0.0 < time_range1_1.upper) &
                                        (uint)time_range1_1.upper,
                                        ~-(uint)(1.0 < time_range1_1.lower)) & 0xffffffff3f800000 |
                              (ulong)((uint)time_range1_1.lower & -(uint)(1.0 < time_range1_1.lower)
                                     ));
        bVar34 = local_1a00 != (PrimRefVector)0x0;
        BStack_1930 = BStack_17d0;
        local_1738 = BVar28;
        BStack_1730 = BVar20;
        local_1708 = BVar26;
      }
      lVar25 = local_640;
      local_1a00 = (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                    *)0x0;
      pBVar27 = local_8c8[uVar29];
      if (local_1908 == *pBVar27) {
        pBVar27[1] = (BBox1f)((long)pBVar27[1] + 1);
        BVar26 = local_1908;
      }
      else {
        local_640 = local_640 + 1;
        (&local_840)[lVar25 * 2] = local_1908;
        (&local_838)[lVar25 * 2] = 1;
        local_8c8[uVar29] = &local_840 + lVar25 * 2;
        BVar26 = *pBVar27;
      }
      lVar25 = local_640;
      if (local_1708 == BVar26) {
        local_8c8[local_848] = pBVar27;
        BVar26 = pBVar27[1];
        pBVar27[1] = (BBox1f)((long)BVar26 + 1);
      }
      else {
        local_640 = local_640 + 1;
        (&local_840)[lVar25 * 2] = local_1708;
        (&local_838)[lVar25 * 2] = 1;
        local_8c8[local_848] = &local_840 + lVar25 * 2;
        BVar26 = (BBox1f)((long)pBVar27[1] + -1);
      }
      pBVar27[1] = BVar26;
      if (BVar26 == (BBox1f)0x0) {
        BVar26 = *pBVar27;
        if (BVar26 != (BBox1f)0x0) {
          lVar25 = *(long *)((long)BVar26 + 0x18);
          pvVar9 = *(void **)((long)BVar26 + 0x20);
          if (pvVar9 != (void *)0x0) {
            if ((ulong)(lVar25 * 0x50) < 0x1c00000) {
              alignedFree(pvVar9);
            }
            else {
              os_free(pvVar9,lVar25 * 0x50,*(bool *)((long)BVar26 + 8));
            }
          }
          if (lVar25 != 0) {
            (**(code **)**(undefined8 **)BVar26)(*(undefined8 **)BVar26,lVar25 * -0x50,1);
          }
          *(undefined8 *)((long)BVar26 + 0x10) = 0;
          *(undefined8 *)((long)BVar26 + 0x18) = 0;
          *(undefined8 *)((long)BVar26 + 0x20) = 0;
        }
        operator_delete((void *)BVar26);
      }
      (&lock)[uVar31 * 0xb].mutex = (MutexSys *)isLeft.split;
      *(vbool **)(&local_13b8 + uVar31 * 0xb) = isLeft.vSplitMask;
      *(undefined8 *)((long)&local_13b8 + uVar31 * 0xb0 + 8) = uStack_1990;
      *(undefined8 *)((long)&local_13a8 + uVar31 * 0xb0) = local_1988._0_8_;
      *(undefined8 *)((long)&local_13a8 + uVar31 * 0xb0 + 8) = local_1988._8_8_;
      *(undefined8 *)(&local_1398 + uVar31 * 0xb) = local_1978._0_8_;
      *(undefined8 *)((long)&local_1398 + uVar31 * 0xb0 + 8) = local_1978._8_8_;
      *(undefined8 *)((long)&local_1388 + uVar31 * 0xb0) = local_1968._0_8_;
      *(undefined8 *)((long)&local_1388 + uVar31 * 0xb0 + 8) = local_1968._8_8_;
      *(BBox1f *)(&local_1378 + uVar31 * 0xb) = local_1958;
      *(char (*) [8])((long)&local_1378 + uVar31 * 0xb0 + 8) = acStack_1950;
      (&local_1368)[uVar31 * 0x16] = local_1948;
      (&local_1368)[uVar31 * 0x16 + 1] = BStack_1940;
      (&local_1358)[uVar31 * 0x16] = local_1938;
      (&local_1358)[uVar31 * 0x16 + 1] = BStack_1930;
      *(ulong *)(local_1348 + uVar31 * 0x2c) = CONCAT44(uStack_1924,local_1928);
      (&uStack_1340)[uVar31 * 0x16] = CONCAT44(uStack_191c,uStack_1920);
      (&local_1338)[uVar31 * 0x16] = local_1918;
      local_1328[uVar31 * 0x16 + -1] = BStack_1910;
      local_1328[uVar31 * 0x16] = local_1908;
      uVar17 = local_848;
      (&lock)[local_848 * 0xb].mutex = (MutexSys *)vSplitPos.field_0.v[0];
      *(undefined8 *)(&local_13b8 + uVar17 * 0xb) = local_1798._0_8_;
      *(undefined8 *)((long)&local_13b8 + uVar17 * 0xb0 + 8) = local_1798._8_8_;
      *(intrusive_list_node **)((long)&local_13a8 + uVar17 * 0xb0) = local_1788;
      *(intrusive_list_node **)((long)&local_13a8 + uVar17 * 0xb0 + 8) = piStack_1780;
      *(__base_type *)&(&local_1398)[uVar17 * 0xb].field_1.x = local_1778._M_b._M_p;
      *(void **)((long)&local_1398 + uVar17 * 0xb0 + 8) = pvStack_1770;
      *(string_resource_index *)((long)&local_1388 + uVar17 * 0xb0) = local_1768;
      *(undefined8 *)((long)&local_1388 + uVar17 * 0xb0 + 8) = acStack_1760._0_8_;
      *(undefined8 *)(&local_1378 + uVar17 * 0xb) = acStack_1760._8_8_;
      *(undefined8 *)((long)&local_1378 + uVar17 * 0xb0 + 8) = acStack_1760._16_8_;
      (&local_1368)[uVar17 * 0x16] = local_1748;
      (&local_1368)[uVar17 * 0x16 + 1] = BStack_1740;
      (&local_1358)[uVar17 * 0x16] = local_1738;
      (&local_1358)[uVar17 * 0x16 + 1] = BStack_1730;
      local_1348[uVar17 * 0x2c] = local_1728;
      local_1348[uVar17 * 0x2c + 1] = fStack_1724;
      *(undefined4 *)(&uStack_1340 + uVar17 * 0x16) = uStack_1720;
      *(undefined4 *)((long)&uStack_1340 + uVar17 * 0xb0 + 4) = uStack_171c;
      (&local_1338)[uVar17 * 0x16] = local_1718;
      local_1328[uVar17 * 0x16 + -1] = BStack_1710;
      local_1328[uVar17 * 0x16] = local_1708;
      local_848 = local_848 + 1;
      if (local_1a00 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&local_1a00,local_1a00);
      }
      uVar17 = (ulong)CONCAT31((int3)((uint)uVar4 >> 8),(byte)uVar4 | bVar34);
    } while (local_848 < (this->cfg).branchingFactor);
  }
  if (local_848 != 0) {
    pfVar22 = (float *)((long)&uStack_1330 + 4);
    uVar31 = local_848;
    do {
      uVar17 = (ulong)(byte)((byte)uVar17 |
                            -(*pfVar22 < (current->prims).super_PrimInfoMB.time_range.upper ||
                             (current->prims).super_PrimInfoMB.time_range.lower < pfVar22[-1]));
      pfVar22 = pfVar22 + 0x2c;
      uVar31 = uVar31 - 1;
    } while (uVar31 != 0);
  }
  if ((uVar17 & 1) == 0) {
    _reduction = (code *)0xe0;
    pTVar6 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar6->alloc)._M_b._M_p) {
      vSplitPos.field_0.v[1]._0_1_ = 1;
      vSplitPos.field_0.v[0] = (longlong)pTVar6;
      MutexSys::lock(&pTVar6->mutex);
      if ((pTVar6->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar6->alloc1).bytesUsed + (pTVar6->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar6->alloc0).end + (pTVar6->alloc1).end) -
             ((pTVar6->alloc0).cur + (pTVar6->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar6->alloc1).bytesWasted + (pTVar6->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar6->alloc0).bytesUsed = 0;
      (pTVar6->alloc0).bytesWasted = 0;
      (pTVar6->alloc0).end = 0;
      (pTVar6->alloc0).allocBlockSize = 0;
      (pTVar6->alloc0).ptr = (char *)0x0;
      (pTVar6->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar6->alloc1).bytesUsed = 0;
        (pTVar6->alloc1).bytesWasted = 0;
        (pTVar6->alloc1).end = 0;
        (pTVar6->alloc1).allocBlockSize = 0;
        (pTVar6->alloc1).ptr = (char *)0x0;
        (pTVar6->alloc1).cur = 0;
      }
      else {
        (pTVar6->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar6->alloc1).ptr = (char *)0x0;
        (pTVar6->alloc1).cur = 0;
        (pTVar6->alloc1).end = 0;
        (pTVar6->alloc1).allocBlockSize = 0;
        (pTVar6->alloc1).bytesUsed = 0;
        (pTVar6->alloc1).bytesWasted = 0;
        (pTVar6->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar6->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
      isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
      vSplitMask.field_0._0_8_ = pTVar6;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar7._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar7,(ThreadLocal2 **)&vSplitMask);
      }
      else {
        *iVar7._M_current = (ThreadLocal2 *)vSplitMask.field_0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (vSplitPos.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)vSplitPos.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)_reduction;
    sVar23 = (alloc.talloc0)->cur;
    uVar31 = (ulong)(-(int)sVar23 & 0xf);
    uVar30 = sVar23 + (long)_reduction + uVar31;
    (alloc.talloc0)->cur = uVar30;
    if ((alloc.talloc0)->end < uVar30) {
      (alloc.talloc0)->cur = sVar23;
      if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
        pcVar32 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
      }
      else {
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar32 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar32;
        sVar23 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar23;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
          pcVar32 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
          (alloc.talloc0)->ptr = pcVar32;
          sVar23 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar23;
          (alloc.talloc0)->end = (size_t)isLeft.split;
          (alloc.talloc0)->cur = (size_t)_reduction;
          if (isLeft.split < _reduction) {
            (alloc.talloc0)->cur = 0;
            pcVar32 = (char *)0x0;
            goto LAB_00c736f0;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar23;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar31;
      pcVar32 = (alloc.talloc0)->ptr + (uVar30 - (long)_reduction);
    }
LAB_00c736f0:
    pcVar32[0x60] = '\0';
    pcVar32[0x61] = '\0';
    pcVar32[0x62] = -0x80;
    pcVar32[99] = '\x7f';
    pcVar32[100] = '\0';
    pcVar32[0x65] = '\0';
    pcVar32[0x66] = -0x80;
    pcVar32[0x67] = '\x7f';
    pcVar32[0x68] = '\0';
    pcVar32[0x69] = '\0';
    pcVar32[0x6a] = -0x80;
    pcVar32[0x6b] = '\x7f';
    pcVar32[0x6c] = '\0';
    pcVar32[0x6d] = '\0';
    pcVar32[0x6e] = -0x80;
    pcVar32[0x6f] = '\x7f';
    pcVar32[0x40] = '\0';
    pcVar32[0x41] = '\0';
    pcVar32[0x42] = -0x80;
    pcVar32[0x43] = '\x7f';
    pcVar32[0x44] = '\0';
    pcVar32[0x45] = '\0';
    pcVar32[0x46] = -0x80;
    pcVar32[0x47] = '\x7f';
    pcVar32[0x48] = '\0';
    pcVar32[0x49] = '\0';
    pcVar32[0x4a] = -0x80;
    pcVar32[0x4b] = '\x7f';
    pcVar32[0x4c] = '\0';
    pcVar32[0x4d] = '\0';
    pcVar32[0x4e] = -0x80;
    pcVar32[0x4f] = '\x7f';
    pcVar32[0x20] = '\0';
    pcVar32[0x21] = '\0';
    pcVar32[0x22] = -0x80;
    pcVar32[0x23] = '\x7f';
    pcVar32[0x24] = '\0';
    pcVar32[0x25] = '\0';
    pcVar32[0x26] = -0x80;
    pcVar32[0x27] = '\x7f';
    pcVar32[0x28] = '\0';
    pcVar32[0x29] = '\0';
    pcVar32[0x2a] = -0x80;
    pcVar32[0x2b] = '\x7f';
    pcVar32[0x2c] = '\0';
    pcVar32[0x2d] = '\0';
    pcVar32[0x2e] = -0x80;
    pcVar32[0x2f] = '\x7f';
    pcVar32[0x70] = '\0';
    pcVar32[0x71] = '\0';
    pcVar32[0x72] = -0x80;
    pcVar32[0x73] = -1;
    pcVar32[0x74] = '\0';
    pcVar32[0x75] = '\0';
    pcVar32[0x76] = -0x80;
    pcVar32[0x77] = -1;
    pcVar32[0x78] = '\0';
    pcVar32[0x79] = '\0';
    pcVar32[0x7a] = -0x80;
    pcVar32[0x7b] = -1;
    pcVar32[0x7c] = '\0';
    pcVar32[0x7d] = '\0';
    pcVar32[0x7e] = -0x80;
    pcVar32[0x7f] = -1;
    pcVar32[0x50] = '\0';
    pcVar32[0x51] = '\0';
    pcVar32[0x52] = -0x80;
    pcVar32[0x53] = -1;
    pcVar32[0x54] = '\0';
    pcVar32[0x55] = '\0';
    pcVar32[0x56] = -0x80;
    pcVar32[0x57] = -1;
    pcVar32[0x58] = '\0';
    pcVar32[0x59] = '\0';
    pcVar32[0x5a] = -0x80;
    pcVar32[0x5b] = -1;
    pcVar32[0x5c] = '\0';
    pcVar32[0x5d] = '\0';
    pcVar32[0x5e] = -0x80;
    pcVar32[0x5f] = -1;
    pcVar32[0x30] = '\0';
    pcVar32[0x31] = '\0';
    pcVar32[0x32] = -0x80;
    pcVar32[0x33] = -1;
    pcVar32[0x34] = '\0';
    pcVar32[0x35] = '\0';
    pcVar32[0x36] = -0x80;
    pcVar32[0x37] = -1;
    pcVar32[0x38] = '\0';
    pcVar32[0x39] = '\0';
    pcVar32[0x3a] = -0x80;
    pcVar32[0x3b] = -1;
    pcVar32[0x3c] = '\0';
    pcVar32[0x3d] = '\0';
    pcVar32[0x3e] = -0x80;
    pcVar32[0x3f] = -1;
    pcVar32[0x80] = '\0';
    pcVar32[0x81] = '\0';
    pcVar32[0x82] = '\0';
    pcVar32[0x83] = '\0';
    pcVar32[0x84] = '\0';
    pcVar32[0x85] = '\0';
    pcVar32[0x86] = '\0';
    pcVar32[0x87] = '\0';
    pcVar32[0x88] = '\0';
    pcVar32[0x89] = '\0';
    pcVar32[0x8a] = '\0';
    pcVar32[0x8b] = '\0';
    pcVar32[0x8c] = '\0';
    pcVar32[0x8d] = '\0';
    pcVar32[0x8e] = '\0';
    pcVar32[0x8f] = '\0';
    pcVar32[0x90] = '\0';
    pcVar32[0x91] = '\0';
    pcVar32[0x92] = '\0';
    pcVar32[0x93] = '\0';
    pcVar32[0x94] = '\0';
    pcVar32[0x95] = '\0';
    pcVar32[0x96] = '\0';
    pcVar32[0x97] = '\0';
    pcVar32[0x98] = '\0';
    pcVar32[0x99] = '\0';
    pcVar32[0x9a] = '\0';
    pcVar32[0x9b] = '\0';
    pcVar32[0x9c] = '\0';
    pcVar32[0x9d] = '\0';
    pcVar32[0x9e] = '\0';
    pcVar32[0x9f] = '\0';
    pcVar32[0xa0] = '\0';
    pcVar32[0xa1] = '\0';
    pcVar32[0xa2] = '\0';
    pcVar32[0xa3] = '\0';
    pcVar32[0xa4] = '\0';
    pcVar32[0xa5] = '\0';
    pcVar32[0xa6] = '\0';
    pcVar32[0xa7] = '\0';
    pcVar32[0xa8] = '\0';
    pcVar32[0xa9] = '\0';
    pcVar32[0xaa] = '\0';
    pcVar32[0xab] = '\0';
    pcVar32[0xac] = '\0';
    pcVar32[0xad] = '\0';
    pcVar32[0xae] = '\0';
    pcVar32[0xaf] = '\0';
    pcVar32[0xb0] = '\0';
    pcVar32[0xb1] = '\0';
    pcVar32[0xb2] = '\0';
    pcVar32[0xb3] = '\0';
    pcVar32[0xb4] = '\0';
    pcVar32[0xb5] = '\0';
    pcVar32[0xb6] = '\0';
    pcVar32[0xb7] = '\0';
    pcVar32[0xb8] = '\0';
    pcVar32[0xb9] = '\0';
    pcVar32[0xba] = '\0';
    pcVar32[0xbb] = '\0';
    pcVar32[0xbc] = '\0';
    pcVar32[0xbd] = '\0';
    pcVar32[0xbe] = '\0';
    pcVar32[0xbf] = '\0';
    pcVar32[0xc0] = '\0';
    pcVar32[0xc1] = '\0';
    pcVar32[0xc2] = '\0';
    pcVar32[0xc3] = '\0';
    pcVar32[0xc4] = '\0';
    pcVar32[0xc5] = '\0';
    pcVar32[0xc6] = '\0';
    pcVar32[199] = '\0';
    pcVar32[200] = '\0';
    pcVar32[0xc9] = '\0';
    pcVar32[0xca] = '\0';
    pcVar32[0xcb] = '\0';
    pcVar32[0xcc] = '\0';
    pcVar32[0xcd] = '\0';
    pcVar32[0xce] = '\0';
    pcVar32[0xcf] = '\0';
    pcVar32[0xd0] = '\0';
    pcVar32[0xd1] = '\0';
    pcVar32[0xd2] = '\0';
    pcVar32[0xd3] = '\0';
    pcVar32[0xd4] = '\0';
    pcVar32[0xd5] = '\0';
    pcVar32[0xd6] = '\0';
    pcVar32[0xd7] = '\0';
    pcVar32[0xd8] = '\0';
    pcVar32[0xd9] = '\0';
    pcVar32[0xda] = '\0';
    pcVar32[0xdb] = '\0';
    pcVar32[0xdc] = '\0';
    pcVar32[0xdd] = '\0';
    pcVar32[0xde] = '\0';
    pcVar32[0xdf] = '\0';
    pcVar32[0] = '\b';
    pcVar32[1] = '\0';
    pcVar32[2] = '\0';
    pcVar32[3] = '\0';
    pcVar32[4] = '\0';
    pcVar32[5] = '\0';
    pcVar32[6] = '\0';
    pcVar32[7] = '\0';
    pcVar32[8] = '\b';
    pcVar32[9] = '\0';
    pcVar32[10] = '\0';
    pcVar32[0xb] = '\0';
    pcVar32[0xc] = '\0';
    pcVar32[0xd] = '\0';
    pcVar32[0xe] = '\0';
    pcVar32[0xf] = '\0';
    pcVar32[0x10] = '\b';
    pcVar32[0x11] = '\0';
    pcVar32[0x12] = '\0';
    pcVar32[0x13] = '\0';
    pcVar32[0x14] = '\0';
    pcVar32[0x15] = '\0';
    pcVar32[0x16] = '\0';
    pcVar32[0x17] = '\0';
    pcVar32[0x18] = '\b';
    pcVar32[0x19] = '\0';
    pcVar32[0x1a] = '\0';
    pcVar32[0x1b] = '\0';
    pcVar32[0x1c] = '\0';
    pcVar32[0x1d] = '\0';
    pcVar32[0x1e] = '\0';
    pcVar32[0x1f] = '\0';
    uVar31 = 1;
  }
  else {
    _reduction = (code *)0x100;
    pTVar6 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar6->alloc)._M_b._M_p) {
      vSplitPos.field_0.v[1]._0_1_ = 1;
      vSplitPos.field_0.v[0] = (longlong)pTVar6;
      MutexSys::lock(&pTVar6->mutex);
      if ((pTVar6->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar6->alloc1).bytesUsed + (pTVar6->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar6->alloc0).end + (pTVar6->alloc1).end) -
             ((pTVar6->alloc0).cur + (pTVar6->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar6->alloc1).bytesWasted + (pTVar6->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar6->alloc0).bytesUsed = 0;
      (pTVar6->alloc0).bytesWasted = 0;
      (pTVar6->alloc0).end = 0;
      (pTVar6->alloc0).allocBlockSize = 0;
      (pTVar6->alloc0).ptr = (char *)0x0;
      (pTVar6->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar6->alloc1).bytesUsed = 0;
        (pTVar6->alloc1).bytesWasted = 0;
        (pTVar6->alloc1).end = 0;
        (pTVar6->alloc1).allocBlockSize = 0;
        (pTVar6->alloc1).ptr = (char *)0x0;
        (pTVar6->alloc1).cur = 0;
      }
      else {
        (pTVar6->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar6->alloc1).ptr = (char *)0x0;
        (pTVar6->alloc1).cur = 0;
        (pTVar6->alloc1).end = 0;
        (pTVar6->alloc1).allocBlockSize = 0;
        (pTVar6->alloc1).bytesUsed = 0;
        (pTVar6->alloc1).bytesWasted = 0;
        (pTVar6->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar6->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
      isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
      vSplitMask.field_0._0_8_ = pTVar6;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar7._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar7,(ThreadLocal2 **)&vSplitMask);
      }
      else {
        *iVar7._M_current = (ThreadLocal2 *)vSplitMask.field_0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (vSplitPos.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)vSplitPos.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)_reduction;
    sVar23 = (alloc.talloc0)->cur;
    uVar31 = (ulong)(-(int)sVar23 & 0xf);
    uVar30 = sVar23 + (long)_reduction + uVar31;
    (alloc.talloc0)->cur = uVar30;
    if ((alloc.talloc0)->end < uVar30) {
      (alloc.talloc0)->cur = sVar23;
      if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
        pcVar32 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
      }
      else {
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar32 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar32;
        sVar23 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar23;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
          pcVar32 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
          (alloc.talloc0)->ptr = pcVar32;
          sVar23 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar23;
          (alloc.talloc0)->end = (size_t)isLeft.split;
          (alloc.talloc0)->cur = (size_t)_reduction;
          if (isLeft.split < _reduction) {
            (alloc.talloc0)->cur = 0;
            pcVar32 = (char *)0x0;
            goto LAB_00c735f2;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar23;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar31;
      pcVar32 = (alloc.talloc0)->ptr + (uVar30 - (long)_reduction);
    }
LAB_00c735f2:
    pcVar32[0xe0] = '\0';
    pcVar32[0xe1] = '\0';
    pcVar32[0xe2] = -0x80;
    pcVar32[0xe3] = '\x7f';
    pcVar32[0xe4] = '\0';
    pcVar32[0xe5] = '\0';
    pcVar32[0xe6] = -0x80;
    pcVar32[0xe7] = '\x7f';
    pcVar32[0xe8] = '\0';
    pcVar32[0xe9] = '\0';
    pcVar32[0xea] = -0x80;
    pcVar32[0xeb] = '\x7f';
    pcVar32[0xec] = '\0';
    pcVar32[0xed] = '\0';
    pcVar32[0xee] = -0x80;
    pcVar32[0xef] = '\x7f';
    pcVar32[0xf0] = '\0';
    pcVar32[0xf1] = '\0';
    pcVar32[0xf2] = -0x80;
    pcVar32[0xf3] = -1;
    pcVar32[0xf4] = '\0';
    pcVar32[0xf5] = '\0';
    pcVar32[0xf6] = -0x80;
    pcVar32[0xf7] = -1;
    pcVar32[0xf8] = '\0';
    pcVar32[0xf9] = '\0';
    pcVar32[0xfa] = -0x80;
    pcVar32[0xfb] = -1;
    pcVar32[0xfc] = '\0';
    pcVar32[0xfd] = '\0';
    pcVar32[0xfe] = -0x80;
    pcVar32[0xff] = -1;
    pcVar32[0x60] = '\0';
    pcVar32[0x61] = '\0';
    pcVar32[0x62] = -0x80;
    pcVar32[99] = '\x7f';
    pcVar32[100] = '\0';
    pcVar32[0x65] = '\0';
    pcVar32[0x66] = -0x80;
    pcVar32[0x67] = '\x7f';
    pcVar32[0x68] = '\0';
    pcVar32[0x69] = '\0';
    pcVar32[0x6a] = -0x80;
    pcVar32[0x6b] = '\x7f';
    pcVar32[0x6c] = '\0';
    pcVar32[0x6d] = '\0';
    pcVar32[0x6e] = -0x80;
    pcVar32[0x6f] = '\x7f';
    pcVar32[0x40] = '\0';
    pcVar32[0x41] = '\0';
    pcVar32[0x42] = -0x80;
    pcVar32[0x43] = '\x7f';
    pcVar32[0x44] = '\0';
    pcVar32[0x45] = '\0';
    pcVar32[0x46] = -0x80;
    pcVar32[0x47] = '\x7f';
    pcVar32[0x48] = '\0';
    pcVar32[0x49] = '\0';
    pcVar32[0x4a] = -0x80;
    pcVar32[0x4b] = '\x7f';
    pcVar32[0x4c] = '\0';
    pcVar32[0x4d] = '\0';
    pcVar32[0x4e] = -0x80;
    pcVar32[0x4f] = '\x7f';
    pcVar32[0x20] = '\0';
    pcVar32[0x21] = '\0';
    pcVar32[0x22] = -0x80;
    pcVar32[0x23] = '\x7f';
    pcVar32[0x24] = '\0';
    pcVar32[0x25] = '\0';
    pcVar32[0x26] = -0x80;
    pcVar32[0x27] = '\x7f';
    pcVar32[0x28] = '\0';
    pcVar32[0x29] = '\0';
    pcVar32[0x2a] = -0x80;
    pcVar32[0x2b] = '\x7f';
    pcVar32[0x2c] = '\0';
    pcVar32[0x2d] = '\0';
    pcVar32[0x2e] = -0x80;
    pcVar32[0x2f] = '\x7f';
    pcVar32[0x70] = '\0';
    pcVar32[0x71] = '\0';
    pcVar32[0x72] = -0x80;
    pcVar32[0x73] = -1;
    pcVar32[0x74] = '\0';
    pcVar32[0x75] = '\0';
    pcVar32[0x76] = -0x80;
    pcVar32[0x77] = -1;
    pcVar32[0x78] = '\0';
    pcVar32[0x79] = '\0';
    pcVar32[0x7a] = -0x80;
    pcVar32[0x7b] = -1;
    pcVar32[0x7c] = '\0';
    pcVar32[0x7d] = '\0';
    pcVar32[0x7e] = -0x80;
    pcVar32[0x7f] = -1;
    pcVar32[0x50] = '\0';
    pcVar32[0x51] = '\0';
    pcVar32[0x52] = -0x80;
    pcVar32[0x53] = -1;
    pcVar32[0x54] = '\0';
    pcVar32[0x55] = '\0';
    pcVar32[0x56] = -0x80;
    pcVar32[0x57] = -1;
    pcVar32[0x58] = '\0';
    pcVar32[0x59] = '\0';
    pcVar32[0x5a] = -0x80;
    pcVar32[0x5b] = -1;
    pcVar32[0x5c] = '\0';
    pcVar32[0x5d] = '\0';
    pcVar32[0x5e] = -0x80;
    pcVar32[0x5f] = -1;
    pcVar32[0x30] = '\0';
    pcVar32[0x31] = '\0';
    pcVar32[0x32] = -0x80;
    pcVar32[0x33] = -1;
    pcVar32[0x34] = '\0';
    pcVar32[0x35] = '\0';
    pcVar32[0x36] = -0x80;
    pcVar32[0x37] = -1;
    pcVar32[0x38] = '\0';
    pcVar32[0x39] = '\0';
    pcVar32[0x3a] = -0x80;
    pcVar32[0x3b] = -1;
    pcVar32[0x3c] = '\0';
    pcVar32[0x3d] = '\0';
    pcVar32[0x3e] = -0x80;
    pcVar32[0x3f] = -1;
    pcVar32[0x80] = '\0';
    pcVar32[0x81] = '\0';
    pcVar32[0x82] = '\0';
    pcVar32[0x83] = '\0';
    pcVar32[0x84] = '\0';
    pcVar32[0x85] = '\0';
    pcVar32[0x86] = '\0';
    pcVar32[0x87] = '\0';
    pcVar32[0x88] = '\0';
    pcVar32[0x89] = '\0';
    pcVar32[0x8a] = '\0';
    pcVar32[0x8b] = '\0';
    pcVar32[0x8c] = '\0';
    pcVar32[0x8d] = '\0';
    pcVar32[0x8e] = '\0';
    pcVar32[0x8f] = '\0';
    pcVar32[0x90] = '\0';
    pcVar32[0x91] = '\0';
    pcVar32[0x92] = '\0';
    pcVar32[0x93] = '\0';
    pcVar32[0x94] = '\0';
    pcVar32[0x95] = '\0';
    pcVar32[0x96] = '\0';
    pcVar32[0x97] = '\0';
    pcVar32[0x98] = '\0';
    pcVar32[0x99] = '\0';
    pcVar32[0x9a] = '\0';
    pcVar32[0x9b] = '\0';
    pcVar32[0x9c] = '\0';
    pcVar32[0x9d] = '\0';
    pcVar32[0x9e] = '\0';
    pcVar32[0x9f] = '\0';
    pcVar32[0xa0] = '\0';
    pcVar32[0xa1] = '\0';
    pcVar32[0xa2] = '\0';
    pcVar32[0xa3] = '\0';
    pcVar32[0xa4] = '\0';
    pcVar32[0xa5] = '\0';
    pcVar32[0xa6] = '\0';
    pcVar32[0xa7] = '\0';
    pcVar32[0xa8] = '\0';
    pcVar32[0xa9] = '\0';
    pcVar32[0xaa] = '\0';
    pcVar32[0xab] = '\0';
    pcVar32[0xac] = '\0';
    pcVar32[0xad] = '\0';
    pcVar32[0xae] = '\0';
    pcVar32[0xaf] = '\0';
    pcVar32[0xb0] = '\0';
    pcVar32[0xb1] = '\0';
    pcVar32[0xb2] = '\0';
    pcVar32[0xb3] = '\0';
    pcVar32[0xb4] = '\0';
    pcVar32[0xb5] = '\0';
    pcVar32[0xb6] = '\0';
    pcVar32[0xb7] = '\0';
    pcVar32[0xb8] = '\0';
    pcVar32[0xb9] = '\0';
    pcVar32[0xba] = '\0';
    pcVar32[0xbb] = '\0';
    pcVar32[0xbc] = '\0';
    pcVar32[0xbd] = '\0';
    pcVar32[0xbe] = '\0';
    pcVar32[0xbf] = '\0';
    pcVar32[0xc0] = '\0';
    pcVar32[0xc1] = '\0';
    pcVar32[0xc2] = '\0';
    pcVar32[0xc3] = '\0';
    pcVar32[0xc4] = '\0';
    pcVar32[0xc5] = '\0';
    pcVar32[0xc6] = '\0';
    pcVar32[199] = '\0';
    pcVar32[200] = '\0';
    pcVar32[0xc9] = '\0';
    pcVar32[0xca] = '\0';
    pcVar32[0xcb] = '\0';
    pcVar32[0xcc] = '\0';
    pcVar32[0xcd] = '\0';
    pcVar32[0xce] = '\0';
    pcVar32[0xcf] = '\0';
    pcVar32[0xd0] = '\0';
    pcVar32[0xd1] = '\0';
    pcVar32[0xd2] = '\0';
    pcVar32[0xd3] = '\0';
    pcVar32[0xd4] = '\0';
    pcVar32[0xd5] = '\0';
    pcVar32[0xd6] = '\0';
    pcVar32[0xd7] = '\0';
    pcVar32[0xd8] = '\0';
    pcVar32[0xd9] = '\0';
    pcVar32[0xda] = '\0';
    pcVar32[0xdb] = '\0';
    pcVar32[0xdc] = '\0';
    pcVar32[0xdd] = '\0';
    pcVar32[0xde] = '\0';
    pcVar32[0xdf] = '\0';
    pcVar32[0] = '\b';
    pcVar32[1] = '\0';
    pcVar32[2] = '\0';
    pcVar32[3] = '\0';
    pcVar32[4] = '\0';
    pcVar32[5] = '\0';
    pcVar32[6] = '\0';
    pcVar32[7] = '\0';
    pcVar32[8] = '\b';
    pcVar32[9] = '\0';
    pcVar32[10] = '\0';
    pcVar32[0xb] = '\0';
    pcVar32[0xc] = '\0';
    pcVar32[0xd] = '\0';
    pcVar32[0xe] = '\0';
    pcVar32[0xf] = '\0';
    pcVar32[0x10] = '\b';
    pcVar32[0x11] = '\0';
    pcVar32[0x12] = '\0';
    pcVar32[0x13] = '\0';
    pcVar32[0x14] = '\0';
    pcVar32[0x15] = '\0';
    pcVar32[0x16] = '\0';
    pcVar32[0x17] = '\0';
    pcVar32[0x18] = '\b';
    pcVar32[0x19] = '\0';
    pcVar32[0x1a] = '\0';
    pcVar32[0x1b] = '\0';
    pcVar32[0x1c] = '\0';
    pcVar32[0x1d] = '\0';
    pcVar32[0x1e] = '\0';
    pcVar32[0x1f] = '\0';
    uVar31 = 6;
  }
  uVar30 = local_848;
  local_1a08 = (HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::RecalculatePrimRef<embree::Instance>,_2UL>
                *)(uVar31 | (ulong)pcVar32);
  if ((this->cfg).singleThreadThreshold <
      (current->prims).super_PrimInfoMB.object_range._end -
      (current->prims).super_PrimInfoMB.object_range._begin) {
    vSplitMask.field_0._0_8_ = values;
    local_1828._0_8_ = &lock;
    isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
    vSplitMask.field_0._8_8_ = this;
    tbb::detail::r1::initialize((task_group_context *)&isLeft);
    vSplitPos.field_0.v[0] = uVar30;
    vSplitPos.field_0.v[1] = 0;
    local_1798._0_8_ = (BBox1f *)0x1;
    _reduction = (code *)&vSplitMask;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)&vSplitPos,(anon_class_8_1_898bcfc2 *)&reduction,
          (auto_partitioner *)&reduction2,(task_group_context *)&isLeft);
    cVar15 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
    if (cVar15 != '\0') {
      prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar24,"task cancelled");
      __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)&isLeft);
    local_19c8 = _DAT_01f7aa00;
    aVar37 = _DAT_01f7aa00;
    aVar41 = _DAT_01f7a9f0;
    aVar38 = _DAT_01f7a9f0;
    if (local_848 == 0) goto LAB_00c73b22;
    paVar21 = &values[0].lbounds.bounds1.upper.field_0;
    uVar31 = local_848;
    do {
      aVar41.m128 = (__m128)minps(aVar41.m128,paVar21[-3]);
      aVar37.m128 = (__m128)maxps(aVar37.m128,paVar21[-2]);
      aVar38.m128 = (__m128)minps(aVar38.m128,*(undefined1 (*) [16])&paVar21[-1].field_1.x);
      local_19c8.m128 = (__m128)maxps(local_19c8.m128,*paVar21);
      paVar21 = paVar21 + 6;
      uVar31 = uVar31 - 1;
    } while (uVar31 != 0);
  }
  else if ((long)(local_848 - 1) < 0) {
    local_19c8 = _DAT_01f7aa00;
    aVar37 = _DAT_01f7aa00;
    aVar41 = _DAT_01f7a9f0;
    aVar38 = _DAT_01f7a9f0;
  }
  else {
    pBVar27 = &BStack_648 + local_848 * 0xc;
    current_00 = (BuildRecord *)&(&lock)[local_848 * 0xb].mutex;
    local_19f8._8_8_ = 0x7f8000007f800000;
    local_19f8._0_8_ = 0x7f8000007f800000;
    local_19e8._8_8_ = 0x7f8000007f800000;
    local_19e8._0_8_ = 0x7f8000007f800000;
    local_1a18._8_8_ = 0xff800000ff800000;
    local_1a18._0_8_ = 0xff800000ff800000;
    local_19c8._8_8_ = 0xff800000ff800000;
    local_19c8._0_8_ = 0xff800000ff800000;
    uVar31 = local_848;
    do {
      current_00 = current_00 + -1;
      alloc_01.talloc0 = alloc.talloc0;
      alloc_01.alloc = alloc.alloc;
      alloc_01.talloc1 = alloc.talloc1;
      recurse((NodeRecordMB4D *)&isLeft,this,current_00,alloc_01,false);
      pBVar27[-10] = (BBox1f)isLeft.split;
      auVar13._8_8_ = uStack_1990;
      auVar13._0_8_ = isLeft.vSplitMask;
      *(undefined1 (*) [16])(pBVar27 + -8) = auVar13;
      auVar47._8_8_ = local_1988._8_8_;
      auVar47._0_8_ = local_1988._0_8_;
      *(undefined1 (*) [16])(pBVar27 + -6) = auVar47;
      auVar49._8_8_ = local_1978._8_8_;
      auVar49._0_8_ = local_1978._0_8_;
      *(undefined1 (*) [16])(pBVar27 + -4) = auVar49;
      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
       ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar27 + -2))->m128 = local_1968;
      *pBVar27 = local_1958;
      aVar41.m128 = (__m128)minps(local_19f8.m128,auVar13);
      aVar37.m128 = (__m128)maxps(local_1a18.m128,auVar47);
      aVar38.m128 = (__m128)minps(local_19e8.m128,auVar49);
      local_19c8.m128 = (__m128)maxps(local_19c8.m128,local_1968.v);
      uVar31 = uVar31 - 1;
      pBVar27 = pBVar27 + -0xc;
      local_1a18 = aVar37;
      local_19f8 = aVar41;
      local_19e8 = aVar38;
    } while (0 < (long)uVar31);
  }
  auVar13 = _DAT_01f80810;
  auVar39 = _DAT_01f80800;
  if (((uint)local_1a08 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar30 = (ulong)pcVar32 & 0xfffffffffffffff0;
      pfVar22 = &values[0].dt.upper;
      uVar31 = 0;
      do {
        *(undefined8 *)(uVar30 + uVar31 * 8) = *(undefined8 *)(pfVar22 + -0x15);
        fVar52 = ((BBox1f *)(pfVar22 + -1))->lower;
        fVar42 = 1.0 / (*pfVar22 - fVar52);
        fVar43 = -fVar52 * fVar42;
        fVar40 = 1.0 - fVar43;
        auVar48._0_4_ = pfVar22[-0x11] * fVar40 + pfVar22[-9] * fVar43;
        auVar48._4_4_ = pfVar22[-0x10] * fVar40 + pfVar22[-8] * fVar43;
        auVar48._8_4_ = pfVar22[-0xf] * fVar40 + pfVar22[-7] * fVar43;
        auVar48._12_4_ = pfVar22[-0xe] * fVar40 + pfVar22[-6] * fVar43;
        auVar50._0_4_ = fVar40 * pfVar22[-0xd] + fVar43 * pfVar22[-5];
        auVar50._4_4_ = fVar40 * pfVar22[-0xc] + fVar43 * pfVar22[-4];
        auVar50._8_4_ = fVar40 * pfVar22[-0xb] + fVar43 * pfVar22[-3];
        auVar50._12_4_ = fVar40 * pfVar22[-10] + fVar43 * pfVar22[-2];
        fVar42 = (1.0 - fVar52) * fVar42;
        fVar52 = 1.0 - fVar42;
        auVar46._0_4_ = pfVar22[-0x11] * fVar52 + pfVar22[-9] * fVar42;
        auVar46._4_4_ = pfVar22[-0x10] * fVar52 + pfVar22[-8] * fVar42;
        auVar46._8_4_ = pfVar22[-0xf] * fVar52 + pfVar22[-7] * fVar42;
        auVar46._12_4_ = pfVar22[-0xe] * fVar52 + pfVar22[-6] * fVar42;
        auVar53._0_4_ = fVar52 * pfVar22[-0xd] + fVar42 * pfVar22[-5];
        auVar53._4_4_ = fVar52 * pfVar22[-0xc] + fVar42 * pfVar22[-4];
        auVar53._8_4_ = fVar52 * pfVar22[-0xb] + fVar42 * pfVar22[-3];
        auVar53._12_4_ = fVar52 * pfVar22[-10] + fVar42 * pfVar22[-2];
        auVar49 = minps(auVar48,auVar13);
        auVar51 = maxps(auVar50,auVar39);
        auVar47 = minps(auVar46,auVar13);
        auVar54 = maxps(auVar53,auVar39);
        fVar52 = auVar49._0_4_ - ABS(auVar49._0_4_) * 4.7683716e-07;
        fVar40 = auVar49._4_4_ - ABS(auVar49._4_4_) * 4.7683716e-07;
        fVar42 = auVar49._8_4_ - ABS(auVar49._8_4_) * 4.7683716e-07;
        fVar43 = ABS(auVar51._0_4_) * 4.7683716e-07 + auVar51._0_4_;
        fVar44 = ABS(auVar51._4_4_) * 4.7683716e-07 + auVar51._4_4_;
        fVar45 = ABS(auVar51._8_4_) * 4.7683716e-07 + auVar51._8_4_;
        *(float *)(uVar30 + 0x20 + uVar31 * 4) = fVar52;
        *(float *)(uVar30 + 0x40 + uVar31 * 4) = fVar40;
        *(float *)(uVar30 + 0x60 + uVar31 * 4) = fVar42;
        *(float *)(uVar30 + 0x30 + uVar31 * 4) = fVar43;
        *(float *)(uVar30 + 0x50 + uVar31 * 4) = fVar44;
        *(float *)(uVar30 + 0x70 + uVar31 * 4) = fVar45;
        *(float *)(uVar30 + 0x80 + uVar31 * 4) =
             (auVar47._0_4_ - ABS(auVar47._0_4_) * 4.7683716e-07) - fVar52;
        *(float *)(uVar30 + 0xa0 + uVar31 * 4) =
             (auVar47._4_4_ - ABS(auVar47._4_4_) * 4.7683716e-07) - fVar40;
        *(float *)(uVar30 + 0xc0 + uVar31 * 4) =
             (auVar47._8_4_ - ABS(auVar47._8_4_) * 4.7683716e-07) - fVar42;
        *(float *)(uVar30 + 0x90 + uVar31 * 4) =
             (ABS(auVar54._0_4_) * 4.7683716e-07 + auVar54._0_4_) - fVar43;
        *(float *)(uVar30 + 0xb0 + uVar31 * 4) =
             (ABS(auVar54._4_4_) * 4.7683716e-07 + auVar54._4_4_) - fVar44;
        *(float *)(uVar30 + 0xd0 + uVar31 * 4) =
             (ABS(auVar54._8_4_) * 4.7683716e-07 + auVar54._8_4_) - fVar45;
        uVar31 = uVar31 + 1;
        pfVar22 = pfVar22 + 0x18;
        local_1a18 = aVar37;
        local_19f8 = aVar41;
        local_19e8 = aVar38;
      } while (local_848 != uVar31);
    }
  }
  else {
    local_1a18 = aVar37;
    local_19f8 = aVar41;
    local_19e8 = aVar38;
    if (local_848 != 0) {
      uVar30 = (ulong)pcVar32 & 0xfffffffffffffff0;
      pfVar22 = &values[0].dt.upper;
      uVar31 = 0;
      do {
        *(undefined8 *)(uVar30 + uVar31 * 8) = *(undefined8 *)(pfVar22 + -0x15);
        fVar52 = ((BBox1f *)(pfVar22 + -1))->lower;
        fVar42 = 1.0 / (*pfVar22 - fVar52);
        fVar43 = -fVar52 * fVar42;
        fVar40 = 1.0 - fVar43;
        auVar54._0_4_ = pfVar22[-0x11] * fVar40 + pfVar22[-9] * fVar43;
        auVar54._4_4_ = pfVar22[-0x10] * fVar40 + pfVar22[-8] * fVar43;
        auVar54._8_4_ = pfVar22[-0xf] * fVar40 + pfVar22[-7] * fVar43;
        auVar54._12_4_ = pfVar22[-0xe] * fVar40 + pfVar22[-6] * fVar43;
        auVar55._0_4_ = fVar40 * pfVar22[-0xd] + fVar43 * pfVar22[-5];
        auVar55._4_4_ = fVar40 * pfVar22[-0xc] + fVar43 * pfVar22[-4];
        auVar55._8_4_ = fVar40 * pfVar22[-0xb] + fVar43 * pfVar22[-3];
        auVar55._12_4_ = fVar40 * pfVar22[-10] + fVar43 * pfVar22[-2];
        fVar42 = (1.0 - fVar52) * fVar42;
        fVar52 = 1.0 - fVar42;
        auVar51._0_4_ = pfVar22[-0x11] * fVar52 + pfVar22[-9] * fVar42;
        auVar51._4_4_ = pfVar22[-0x10] * fVar52 + pfVar22[-8] * fVar42;
        auVar51._8_4_ = pfVar22[-0xf] * fVar52 + pfVar22[-7] * fVar42;
        auVar51._12_4_ = pfVar22[-0xe] * fVar52 + pfVar22[-6] * fVar42;
        auVar56._0_4_ = fVar52 * pfVar22[-0xd] + fVar42 * pfVar22[-5];
        auVar56._4_4_ = fVar52 * pfVar22[-0xc] + fVar42 * pfVar22[-4];
        auVar56._8_4_ = fVar52 * pfVar22[-0xb] + fVar42 * pfVar22[-3];
        auVar56._12_4_ = fVar52 * pfVar22[-10] + fVar42 * pfVar22[-2];
        auVar49 = minps(auVar54,auVar13);
        auVar54 = maxps(auVar55,auVar39);
        auVar47 = minps(auVar51,auVar13);
        auVar51 = maxps(auVar56,auVar39);
        fVar52 = auVar49._0_4_ - ABS(auVar49._0_4_) * 4.7683716e-07;
        fVar40 = auVar49._4_4_ - ABS(auVar49._4_4_) * 4.7683716e-07;
        fVar42 = auVar49._8_4_ - ABS(auVar49._8_4_) * 4.7683716e-07;
        fVar43 = ABS(auVar54._0_4_) * 4.7683716e-07 + auVar54._0_4_;
        fVar44 = ABS(auVar54._4_4_) * 4.7683716e-07 + auVar54._4_4_;
        fVar45 = ABS(auVar54._8_4_) * 4.7683716e-07 + auVar54._8_4_;
        *(float *)(uVar30 + 0x20 + uVar31 * 4) = fVar52;
        *(float *)(uVar30 + 0x40 + uVar31 * 4) = fVar40;
        *(float *)(uVar30 + 0x60 + uVar31 * 4) = fVar42;
        *(float *)(uVar30 + 0x30 + uVar31 * 4) = fVar43;
        *(float *)(uVar30 + 0x50 + uVar31 * 4) = fVar44;
        *(float *)(uVar30 + 0x70 + uVar31 * 4) = fVar45;
        *(float *)(uVar30 + 0x80 + uVar31 * 4) =
             (auVar47._0_4_ - ABS(auVar47._0_4_) * 4.7683716e-07) - fVar52;
        *(float *)(uVar30 + 0xa0 + uVar31 * 4) =
             (auVar47._4_4_ - ABS(auVar47._4_4_) * 4.7683716e-07) - fVar40;
        *(float *)(uVar30 + 0xc0 + uVar31 * 4) =
             (auVar47._8_4_ - ABS(auVar47._8_4_) * 4.7683716e-07) - fVar42;
        *(float *)(uVar30 + 0x90 + uVar31 * 4) =
             (ABS(auVar51._0_4_) * 4.7683716e-07 + auVar51._0_4_) - fVar43;
        *(float *)(uVar30 + 0xb0 + uVar31 * 4) =
             (ABS(auVar51._4_4_) * 4.7683716e-07 + auVar51._4_4_) - fVar44;
        *(float *)(uVar30 + 0xd0 + uVar31 * 4) =
             (ABS(auVar51._8_4_) * 4.7683716e-07 + auVar51._8_4_) - fVar45;
        *(float *)(uVar30 + 0xe0 + uVar31 * 4) = ((BBox1f *)(pfVar22 + -1))->lower;
        uVar35 = -(uint)(*pfVar22 == 1.0);
        *(uint *)(uVar30 + 0xf0 + uVar31 * 4) = ~uVar35 & (uint)*pfVar22 | uVar35 & 0x3f800001;
        uVar31 = uVar31 + 1;
        pfVar22 = pfVar22 + 0x18;
      } while (local_848 != uVar31);
    }
  }
LAB_00c73b22:
  if ((uVar17 & 1) == 0) {
    (local_18f0->ref).ptr = (size_t)local_1a08;
    (local_18f0->lbounds).bounds0.lower.field_0 = aVar41;
    (local_18f0->lbounds).bounds0.upper.field_0 = aVar37;
    (local_18f0->lbounds).bounds1.lower.field_0 = aVar38;
    *(undefined8 *)&(local_18f0->lbounds).bounds1.upper.field_0 = local_19c8._0_8_;
    *(undefined8 *)((long)&(local_18f0->lbounds).bounds1.upper.field_0 + 8) = local_19c8._8_8_;
    BVar26 = (current->prims).super_PrimInfoMB.time_range;
  }
  else {
    vSplitPos_1.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos_1.field_0.v[0] = (longlong)local_19d0;
    pSVar10 = (Split *)(current->prims).super_PrimInfoMB.object_range._begin;
    pSVar11 = (Split *)(current->prims).super_PrimInfoMB.object_range._end;
    vSplitPos.field_0.v[0] = 0x7f8000007f800000;
    vSplitPos.field_0.v[1] = 0x7f8000007f800000;
    local_1798._0_8_ = (BBox1f *)0xff800000ff800000;
    local_1798._8_8_ = 0xff800000ff800000;
    local_1788 = (intrusive_list_node *)0x7f8000007f800000;
    piStack_1780 = (intrusive_list_node *)0x7f8000007f800000;
    local_1778._M_b._M_p = (__base_type)(__pointer_type)0xff800000ff800000;
    pvStack_1770 = (void *)0xff800000ff800000;
    if ((ulong)((long)pSVar11 - (long)pSVar10) < 0xc00) {
      isLeft.split = pSVar10;
      isLeft.vSplitPos = (vint *)pSVar11;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&vSplitMask,(anon_class_16_2_aeee9775 *)&vSplitPos_1,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
      tbb::detail::r1::initialize((task_group_context *)&isLeft);
      _reduction2 = &time_range0;
      _reduction = (code *)pSVar11;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&vSplitMask,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&vSplitPos,(LBBox<embree::Vec3fa> *)&reduction2,
                 (anon_class_16_2_ed117de8_conflict31 *)_reduction2,
                 (anon_class_1_0_00000001 *)&isLeft,in_stack_ffffffffffffe5c8);
      cVar15 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar15 != '\0') {
        prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar24,"task cancelled");
        __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&isLeft);
    }
    (local_18f0->ref).ptr = (size_t)local_1a08;
    *(undefined8 *)&(local_18f0->lbounds).bounds0.lower.field_0 = vSplitMask.field_0._0_8_;
    *(undefined8 *)((long)&(local_18f0->lbounds).bounds0.lower.field_0 + 8) =
         vSplitMask.field_0._8_8_;
    *(undefined8 *)&(local_18f0->lbounds).bounds0.upper.field_0 = local_1828._0_8_;
    *(undefined8 *)((long)&(local_18f0->lbounds).bounds0.upper.field_0 + 8) = local_1828._8_8_;
    *(undefined8 *)&(local_18f0->lbounds).bounds1.lower.field_0 = local_1818._0_8_;
    *(undefined8 *)((long)&(local_18f0->lbounds).bounds1.lower.field_0 + 8) = local_1818._8_8_;
    *(undefined8 *)&(local_18f0->lbounds).bounds1.upper.field_0 = local_1808._0_8_;
    *(undefined8 *)((long)&(local_18f0->lbounds).bounds1.upper.field_0 + 8) = local_1808._8_8_;
    BVar26 = (current->prims).super_PrimInfoMB.time_range;
  }
  pNVar14 = local_18f0;
  local_18f0->dt = BVar26;
  if (local_848 != 0) {
    uVar17 = 0;
    do {
      pBVar8 = local_8c8[uVar17];
      pBVar27 = pBVar8 + 1;
      *pBVar27 = (BBox1f)((long)*pBVar27 + -1);
      if (*pBVar27 == (BBox1f)0x0) {
        BVar26 = *pBVar8;
        if (BVar26 != (BBox1f)0x0) {
          lVar25 = *(long *)((long)BVar26 + 0x18);
          pvVar9 = *(void **)((long)BVar26 + 0x20);
          if (pvVar9 != (void *)0x0) {
            if ((ulong)(lVar25 * 0x50) < 0x1c00000) {
              alignedFree(pvVar9);
            }
            else {
              os_free(pvVar9,lVar25 * 0x50,*(bool *)((long)BVar26 + 8));
            }
          }
          if (lVar25 != 0) {
            (**(code **)**(undefined8 **)BVar26)(*(undefined8 **)BVar26,lVar25 * -0x50,1);
          }
          *(undefined8 *)((long)BVar26 + 0x10) = 0;
          *(undefined8 *)((long)BVar26 + 0x18) = 0;
          *(undefined8 *)((long)BVar26 + 0x20) = 0;
        }
        operator_delete((void *)BVar26);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < local_848);
  }
  if (local_1a20 ==
      (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_> *)
      0x0) {
    return pNVar14;
  }
  std::
  default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                *)&local_1a20,local_1a20);
  return pNVar14;
}

Assistant:

const NodeRecordMB4D recurse(const BuildRecord& current, Allocator alloc, bool toplevel)
          {
            /* get thread local allocator */
            if (!alloc)
              alloc = createAlloc();

            /* call memory monitor function to signal progress */
            if (toplevel && current.size() <= cfg.singleThreadThreshold)
              progressMonitor(current.size());

            /*! find best split */
            const Split csplit = find(current.prims);

            /*! compute leaf and split cost */
            const float leafSAH  = cfg.intCost*current.prims.leafSAH(cfg.logBlockSize);
            const float splitSAH = cfg.travCost*current.prims.halfArea()+cfg.intCost*csplit.splitSAH();
            assert((current.size() == 0) || ((leafSAH >= 0) && (splitSAH >= 0)));

            /*! create a leaf node when threshold reached or SAH tells us to stop */
            if (current.size() <= cfg.minLeafSize || current.depth+MIN_LARGE_LEAF_LEVELS >= cfg.maxDepth || (current.size() <= cfg.maxLeafSize && leafSAH <= splitSAH)) {
              current.prims.deterministic_order();
              return createLargeLeaf(current,alloc);
            }

            /*! perform initial split */
            SetMB lprims,rprims;
            std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,current.prims,lprims,rprims);
            bool hasTimeSplits = new_vector != nullptr;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildList children(current);
            {
              BuildRecord lrecord(lprims,current.depth+1);
              BuildRecord rrecord(rprims,current.depth+1);
              children.split(0,lrecord,rrecord,std::move(new_vector));
            }

            /*! split until node is full or SAH tells us to stop */
            while (children.size() < cfg.branchingFactor) 
            {
              /*! find best child to split */
              float bestArea = neg_inf;
              ssize_t bestChild = -1;
              for (size_t i=0; i<children.size(); i++)
              {
                if (children[i].size() <= cfg.minLeafSize) continue;
                if (expectedApproxHalfArea(children[i].prims.geomBounds) > bestArea) {
                  bestChild = i; bestArea = expectedApproxHalfArea(children[i].prims.geomBounds);
                }
              }
              if (bestChild == -1) break;

              /* perform split */
              BuildRecord& brecord = children[bestChild];
              BuildRecord lrecord(current.depth+1);
              BuildRecord rrecord(current.depth+1);
              Split csplit = find(brecord.prims);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));
            }

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = current.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* sort buildrecords for simpler shadow ray traversal */
            //std::sort(&children[0],&children[children.size()],std::greater<BuildRecord>()); // FIXME: reduces traversal performance of bvh8.triangle4 (need to verified) !!

            /*! create an inner node */
            auto node = createNode(children.children.data(), children.numChildren, alloc, hasTimeSplits);
            LBBox3fa gbounds = empty;

            /* spawn tasks */
            if (unlikely(current.size() > cfg.singleThreadThreshold))
            {
              /*! parallel_for is faster than spawning sub-tasks */
              parallel_for(size_t(0), children.size(), [&] (const range<size_t>& r) {
                  for (size_t i=r.begin(); i<r.end(); i++) {
                    values[i] = recurse(children[i],nullptr,true);
                    _mm_mfence(); // to allow non-temporal stores during build
                  }
                });

              /*! merge bounding boxes */
              for (size_t i=0; i<children.size(); i++)
                gbounds.extend(values[i].lbounds);
            }
            /* recurse into each child */
            else
            {
              //for (size_t i=0; i<children.size(); i++)
              for (ssize_t i=children.size()-1; i>=0; i--) {
                values[i] = recurse(children[i],alloc,false);
                gbounds.extend(values[i].lbounds);
              }
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (unlikely(hasTimeSplits))
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }